

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  Primitive *pPVar2;
  float *pfVar3;
  undefined8 *puVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined3 uVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  bool bVar20;
  undefined8 uVar21;
  RTCFeatureFlags RVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  byte bVar41;
  ulong uVar42;
  ulong uVar43;
  RTCFilterFunctionN p_Var44;
  RayHitK<4> *pRVar45;
  int iVar46;
  RTCIntersectArguments *pRVar47;
  RTCIntersectArguments *pRVar48;
  RTCIntersectArguments *pRVar49;
  ulong uVar50;
  ulong uVar51;
  bool bVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  uint uVar57;
  short sVar58;
  float t1;
  float fVar59;
  float fVar60;
  undefined2 uVar90;
  float fVar91;
  float fVar93;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  float fVar92;
  float fVar94;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar95;
  float fVar109;
  float fVar110;
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar111;
  float fVar128;
  float fVar129;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar130;
  float fVar142;
  float fVar143;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  float fVar144;
  float fVar149;
  float fVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar165;
  float fVar166;
  vfloat4 a;
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar167;
  float fVar178;
  float fVar179;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar180;
  float fVar199;
  float fVar200;
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar201;
  float fVar212;
  float fVar213;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar221;
  float fVar222;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar223;
  float fVar228;
  float fVar229;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar230;
  float fVar231;
  float fVar239;
  float fVar241;
  vfloat4 a_1;
  undefined1 auVar232 [16];
  float fVar243;
  undefined1 auVar235 [16];
  float fVar242;
  float fVar244;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  undefined1 auVar238 [16];
  float fVar245;
  float fVar246;
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar247 [16];
  float fVar252;
  float fVar254;
  float fVar256;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar257;
  float fVar262;
  float fVar263;
  undefined1 auVar258 [16];
  float fVar264;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar265;
  float fVar266;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 local_528;
  undefined8 local_518;
  float local_508;
  float fStack_504;
  float fStack_500;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  RTCFilterFunctionNArguments local_428;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  undefined8 local_378;
  undefined8 uStack_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  uint auStack_2f8 [4];
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  undefined1 local_e8 [12];
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 auStack_58 [5];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 uVar89;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar140 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  
  PVar5 = prim[1];
  uVar42 = (ulong)(byte)PVar5;
  pPVar2 = prim + uVar42 * 0x19 + 6;
  fVar129 = *(float *)(pPVar2 + 0xc);
  fVar130 = (*(float *)(ray + k * 4) - *(float *)pPVar2) * fVar129;
  fVar142 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar2 + 4)) * fVar129;
  fVar143 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar2 + 8)) * fVar129;
  fVar111 = *(float *)(ray + k * 4 + 0x40) * fVar129;
  fVar128 = *(float *)(ray + k * 4 + 0x50) * fVar129;
  fVar129 = *(float *)(ray + k * 4 + 0x60) * fVar129;
  uVar6 = *(undefined4 *)(prim + uVar42 * 4 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar158._8_4_ = 0;
  auVar158._0_8_ = uVar51;
  auVar158._12_2_ = uVar90;
  auVar158._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._8_2_ = 0;
  auVar157._0_8_ = uVar51;
  auVar157._10_2_ = uVar90;
  auVar68._10_6_ = auVar157._10_6_;
  auVar68._8_2_ = uVar90;
  auVar68._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar26._4_8_ = auVar68._8_8_;
  auVar26._2_2_ = uVar90;
  auVar26._0_2_ = uVar90;
  fVar95 = (float)((int)sVar58 >> 8);
  fVar109 = (float)(auVar26._0_4_ >> 0x18);
  fVar110 = (float)(auVar68._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 * 5 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar51;
  auVar61._12_2_ = uVar90;
  auVar61._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar268._12_4_ = auVar61._12_4_;
  auVar268._8_2_ = 0;
  auVar268._0_8_ = uVar51;
  auVar268._10_2_ = uVar90;
  auVar115._10_6_ = auVar268._10_6_;
  auVar115._8_2_ = uVar90;
  auVar115._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar27._4_8_ = auVar115._8_8_;
  auVar27._2_2_ = uVar90;
  auVar27._0_2_ = uVar90;
  fVar144 = (float)((int)sVar58 >> 8);
  fVar149 = (float)(auVar27._0_4_ >> 0x18);
  fVar150 = (float)(auVar115._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 * 6 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar51;
  auVar64._12_2_ = uVar90;
  auVar64._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar51;
  auVar63._10_2_ = uVar90;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar90;
  auVar62._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar28._4_8_ = auVar62._8_8_;
  auVar28._2_2_ = uVar90;
  auVar28._0_2_ = uVar90;
  fVar167 = (float)((int)sVar58 >> 8);
  fVar178 = (float)(auVar28._0_4_ >> 0x18);
  fVar179 = (float)(auVar62._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 * 0xb + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar51;
  auVar67._12_2_ = uVar90;
  auVar67._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar51;
  auVar66._10_2_ = uVar90;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar90;
  auVar65._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar29._4_8_ = auVar65._8_8_;
  auVar29._2_2_ = uVar90;
  auVar29._0_2_ = uVar90;
  fVar59 = (float)((int)sVar58 >> 8);
  fVar91 = (float)(auVar29._0_4_ >> 0x18);
  fVar93 = (float)(auVar65._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar51;
  auVar154._12_2_ = uVar90;
  auVar154._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar51;
  auVar153._10_2_ = uVar90;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar90;
  auVar152._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar30._4_8_ = auVar152._8_8_;
  auVar30._2_2_ = uVar90;
  auVar30._0_2_ = uVar90;
  fVar151 = (float)((int)sVar58 >> 8);
  fVar165 = (float)(auVar30._0_4_ >> 0x18);
  fVar166 = (float)(auVar152._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar42 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar51;
  auVar183._12_2_ = uVar90;
  auVar183._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar51;
  auVar182._10_2_ = uVar90;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar90;
  auVar181._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar31._4_8_ = auVar181._8_8_;
  auVar31._2_2_ = uVar90;
  auVar31._0_2_ = uVar90;
  fVar214 = (float)((int)sVar58 >> 8);
  fVar221 = (float)(auVar31._0_4_ >> 0x18);
  fVar222 = (float)(auVar181._8_4_ >> 0x18);
  uVar50 = (ulong)(uint)((int)(uVar42 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar50 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar51;
  auVar186._12_2_ = uVar90;
  auVar186._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar51;
  auVar185._10_2_ = uVar90;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar90;
  auVar184._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar32._4_8_ = auVar184._8_8_;
  auVar32._2_2_ = uVar90;
  auVar32._0_2_ = uVar90;
  fVar201 = (float)((int)sVar58 >> 8);
  fVar212 = (float)(auVar32._0_4_ >> 0x18);
  fVar213 = (float)(auVar184._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 + uVar42 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar51;
  auVar189._12_2_ = uVar90;
  auVar189._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar51;
  auVar188._10_2_ = uVar90;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar90;
  auVar187._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar33._4_8_ = auVar187._8_8_;
  auVar33._2_2_ = uVar90;
  auVar33._0_2_ = uVar90;
  fVar223 = (float)((int)sVar58 >> 8);
  fVar228 = (float)(auVar33._0_4_ >> 0x18);
  fVar229 = (float)(auVar187._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar43 + 6);
  uVar89 = (undefined1)((uint)uVar6 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar6 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar6));
  uVar89 = (undefined1)((uint)uVar6 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar89),uVar89);
  sVar58 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar25,sVar58);
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar51;
  auVar234._12_2_ = uVar90;
  auVar234._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar51;
  auVar233._10_2_ = uVar90;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._8_2_ = uVar90;
  auVar232._0_8_ = uVar51;
  uVar90 = (undefined2)uVar25;
  auVar34._4_8_ = auVar232._8_8_;
  auVar34._2_2_ = uVar90;
  auVar34._0_2_ = uVar90;
  fVar60 = (float)((int)sVar58 >> 8);
  fVar92 = (float)(auVar34._0_4_ >> 0x18);
  fVar94 = (float)(auVar232._8_4_ >> 0x18);
  fVar245 = fVar111 * fVar95 + fVar128 * fVar144 + fVar129 * fVar167;
  fVar251 = fVar111 * fVar109 + fVar128 * fVar149 + fVar129 * fVar178;
  fVar253 = fVar111 * fVar110 + fVar128 * fVar150 + fVar129 * fVar179;
  fVar255 = fVar111 * (float)(auVar157._12_4_ >> 0x18) +
            fVar128 * (float)(auVar268._12_4_ >> 0x18) + fVar129 * (float)(auVar63._12_4_ >> 0x18);
  fVar230 = fVar111 * fVar59 + fVar128 * fVar151 + fVar129 * fVar214;
  fVar239 = fVar111 * fVar91 + fVar128 * fVar165 + fVar129 * fVar221;
  fVar241 = fVar111 * fVar93 + fVar128 * fVar166 + fVar129 * fVar222;
  fVar243 = fVar111 * (float)(auVar66._12_4_ >> 0x18) +
            fVar128 * (float)(auVar153._12_4_ >> 0x18) + fVar129 * (float)(auVar182._12_4_ >> 0x18);
  fVar180 = fVar111 * fVar201 + fVar128 * fVar223 + fVar129 * fVar60;
  fVar199 = fVar111 * fVar212 + fVar128 * fVar228 + fVar129 * fVar92;
  fVar200 = fVar111 * fVar213 + fVar128 * fVar229 + fVar129 * fVar94;
  fVar111 = fVar111 * (float)(auVar185._12_4_ >> 0x18) +
            fVar128 * (float)(auVar188._12_4_ >> 0x18) + fVar129 * (float)(auVar233._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar144 = fVar95 * fVar130 + fVar144 * fVar142 + fVar167 * fVar143;
  fVar149 = fVar109 * fVar130 + fVar149 * fVar142 + fVar178 * fVar143;
  fVar150 = fVar110 * fVar130 + fVar150 * fVar142 + fVar179 * fVar143;
  fVar167 = (float)(auVar157._12_4_ >> 0x18) * fVar130 +
            (float)(auVar268._12_4_ >> 0x18) * fVar142 + (float)(auVar63._12_4_ >> 0x18) * fVar143;
  fVar178 = fVar59 * fVar130 + fVar151 * fVar142 + fVar214 * fVar143;
  fVar179 = fVar91 * fVar130 + fVar165 * fVar142 + fVar221 * fVar143;
  fVar214 = fVar93 * fVar130 + fVar166 * fVar142 + fVar222 * fVar143;
  fVar221 = (float)(auVar66._12_4_ >> 0x18) * fVar130 +
            (float)(auVar153._12_4_ >> 0x18) * fVar142 + (float)(auVar182._12_4_ >> 0x18) * fVar143;
  fVar151 = fVar130 * fVar201 + fVar142 * fVar223 + fVar143 * fVar60;
  fVar165 = fVar130 * fVar212 + fVar142 * fVar228 + fVar143 * fVar92;
  fVar166 = fVar130 * fVar213 + fVar142 * fVar229 + fVar143 * fVar94;
  fVar130 = fVar130 * (float)(auVar185._12_4_ >> 0x18) +
            fVar142 * (float)(auVar188._12_4_ >> 0x18) + fVar143 * (float)(auVar233._12_4_ >> 0x18);
  fVar129 = (float)DAT_01ff1d40;
  fVar59 = DAT_01ff1d40._4_4_;
  fVar60 = DAT_01ff1d40._8_4_;
  fVar91 = DAT_01ff1d40._12_4_;
  uVar53 = -(uint)(fVar129 <= ABS(fVar245));
  uVar54 = -(uint)(fVar59 <= ABS(fVar251));
  uVar56 = -(uint)(fVar60 <= ABS(fVar253));
  uVar57 = -(uint)(fVar91 <= ABS(fVar255));
  auVar247._0_4_ = (uint)fVar245 & uVar53;
  auVar247._4_4_ = (uint)fVar251 & uVar54;
  auVar247._8_4_ = (uint)fVar253 & uVar56;
  auVar247._12_4_ = (uint)fVar255 & uVar57;
  auVar145._0_4_ = ~uVar53 & (uint)fVar129;
  auVar145._4_4_ = ~uVar54 & (uint)fVar59;
  auVar145._8_4_ = ~uVar56 & (uint)fVar60;
  auVar145._12_4_ = ~uVar57 & (uint)fVar91;
  auVar145 = auVar145 | auVar247;
  uVar53 = -(uint)(fVar129 <= ABS(fVar230));
  uVar54 = -(uint)(fVar59 <= ABS(fVar239));
  uVar56 = -(uint)(fVar60 <= ABS(fVar241));
  uVar57 = -(uint)(fVar91 <= ABS(fVar243));
  auVar235._0_4_ = (uint)fVar230 & uVar53;
  auVar235._4_4_ = (uint)fVar239 & uVar54;
  auVar235._8_4_ = (uint)fVar241 & uVar56;
  auVar235._12_4_ = (uint)fVar243 & uVar57;
  auVar155._0_4_ = ~uVar53 & (uint)fVar129;
  auVar155._4_4_ = ~uVar54 & (uint)fVar59;
  auVar155._8_4_ = ~uVar56 & (uint)fVar60;
  auVar155._12_4_ = ~uVar57 & (uint)fVar91;
  auVar155 = auVar155 | auVar235;
  uVar53 = -(uint)(fVar129 <= ABS(fVar180));
  uVar54 = -(uint)(fVar59 <= ABS(fVar199));
  uVar56 = -(uint)(fVar60 <= ABS(fVar200));
  uVar57 = -(uint)(fVar91 <= ABS(fVar111));
  auVar190._0_4_ = (uint)fVar180 & uVar53;
  auVar190._4_4_ = (uint)fVar199 & uVar54;
  auVar190._8_4_ = (uint)fVar200 & uVar56;
  auVar190._12_4_ = (uint)fVar111 & uVar57;
  auVar168._0_4_ = ~uVar53 & (uint)fVar129;
  auVar168._4_4_ = ~uVar54 & (uint)fVar59;
  auVar168._8_4_ = ~uVar56 & (uint)fVar60;
  auVar168._12_4_ = ~uVar57 & (uint)fVar91;
  auVar168 = auVar168 | auVar190;
  auVar68 = rcpps(_DAT_01ff1d40,auVar145);
  fVar129 = auVar68._0_4_;
  fVar91 = auVar68._4_4_;
  fVar94 = auVar68._8_4_;
  fVar110 = auVar68._12_4_;
  fVar129 = (1.0 - auVar145._0_4_ * fVar129) * fVar129 + fVar129;
  fVar91 = (1.0 - auVar145._4_4_ * fVar91) * fVar91 + fVar91;
  fVar94 = (1.0 - auVar145._8_4_ * fVar94) * fVar94 + fVar94;
  fVar110 = (1.0 - auVar145._12_4_ * fVar110) * fVar110 + fVar110;
  auVar68 = rcpps(auVar68,auVar155);
  fVar59 = auVar68._0_4_;
  fVar92 = auVar68._4_4_;
  fVar95 = auVar68._8_4_;
  fVar111 = auVar68._12_4_;
  fVar59 = (1.0 - auVar155._0_4_ * fVar59) * fVar59 + fVar59;
  fVar92 = (1.0 - auVar155._4_4_ * fVar92) * fVar92 + fVar92;
  fVar95 = (1.0 - auVar155._8_4_ * fVar95) * fVar95 + fVar95;
  fVar111 = (1.0 - auVar155._12_4_ * fVar111) * fVar111 + fVar111;
  auVar68 = rcpps(auVar68,auVar168);
  fVar60 = auVar68._0_4_;
  fVar93 = auVar68._4_4_;
  fVar109 = auVar68._8_4_;
  fVar128 = auVar68._12_4_;
  fVar60 = (1.0 - auVar168._0_4_ * fVar60) * fVar60 + fVar60;
  fVar93 = (1.0 - auVar168._4_4_ * fVar93) * fVar93 + fVar93;
  fVar109 = (1.0 - auVar168._8_4_ * fVar109) * fVar109 + fVar109;
  fVar128 = (1.0 - auVar168._12_4_ * fVar128) * fVar128 + fVar128;
  uVar51 = *(ulong *)(prim + uVar42 * 7 + 6);
  uVar90 = (undefined2)(uVar51 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar51;
  auVar71._12_2_ = uVar90;
  auVar71._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar51 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar51;
  auVar70._10_2_ = uVar90;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar90;
  auVar69._0_8_ = uVar51;
  uVar90 = (undefined2)(uVar51 >> 0x10);
  auVar35._4_8_ = auVar69._8_8_;
  auVar35._2_2_ = uVar90;
  auVar35._0_2_ = uVar90;
  auVar146._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar149) * fVar91,
                ((float)(int)(short)uVar51 - fVar144) * fVar129);
  auVar146._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar150) * fVar94;
  auVar146._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar167) * fVar110;
  uVar51 = *(ulong *)(prim + uVar42 * 9 + 6);
  uVar90 = (undefined2)(uVar51 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar51;
  auVar74._12_2_ = uVar90;
  auVar74._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar51 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar51;
  auVar73._10_2_ = uVar90;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar90;
  auVar72._0_8_ = uVar51;
  uVar90 = (undefined2)(uVar51 >> 0x10);
  auVar36._4_8_ = auVar72._8_8_;
  auVar36._2_2_ = uVar90;
  auVar36._0_2_ = uVar90;
  auVar169._0_4_ = ((float)(int)(short)uVar51 - fVar144) * fVar129;
  auVar169._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar149) * fVar91;
  auVar169._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar150) * fVar94;
  auVar169._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar167) * fVar110;
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar50 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar42 * -2 + 6);
  uVar90 = (undefined2)(uVar50 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar50;
  auVar98._12_2_ = uVar90;
  auVar98._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar50 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar50;
  auVar97._10_2_ = uVar90;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar90;
  auVar96._0_8_ = uVar50;
  uVar90 = (undefined2)(uVar50 >> 0x10);
  auVar37._4_8_ = auVar96._8_8_;
  auVar37._2_2_ = uVar90;
  auVar37._0_2_ = uVar90;
  auVar99._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar179) * fVar92,
                ((float)(int)(short)uVar50 - fVar178) * fVar59);
  auVar99._8_4_ = ((float)(auVar96._8_4_ >> 0x10) - fVar214) * fVar95;
  auVar99._12_4_ = ((float)(auVar97._12_4_ >> 0x10) - fVar221) * fVar111;
  uVar90 = (undefined2)(uVar51 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar51;
  auVar77._12_2_ = uVar90;
  auVar77._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar51 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar51;
  auVar76._10_2_ = uVar90;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar90;
  auVar75._0_8_ = uVar51;
  uVar90 = (undefined2)(uVar51 >> 0x10);
  auVar38._4_8_ = auVar75._8_8_;
  auVar38._2_2_ = uVar90;
  auVar38._0_2_ = uVar90;
  auVar202._0_4_ = ((float)(int)(short)uVar51 - fVar178) * fVar59;
  auVar202._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar179) * fVar92;
  auVar202._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar214) * fVar95;
  auVar202._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar221) * fVar111;
  uVar51 = *(ulong *)(prim + uVar43 + uVar42 + 6);
  uVar90 = (undefined2)(uVar51 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar51;
  auVar80._12_2_ = uVar90;
  auVar80._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar51 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar51;
  auVar79._10_2_ = uVar90;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar90;
  auVar78._0_8_ = uVar51;
  uVar90 = (undefined2)(uVar51 >> 0x10);
  auVar39._4_8_ = auVar78._8_8_;
  auVar39._2_2_ = uVar90;
  auVar39._0_2_ = uVar90;
  auVar81._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar165) * fVar93,
                ((float)(int)(short)uVar51 - fVar151) * fVar60);
  auVar81._8_4_ = ((float)(auVar78._8_4_ >> 0x10) - fVar166) * fVar109;
  auVar81._12_4_ = ((float)(auVar79._12_4_ >> 0x10) - fVar130) * fVar128;
  uVar51 = *(ulong *)(prim + uVar42 * 0x17 + 6);
  uVar90 = (undefined2)(uVar51 >> 0x30);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar51;
  auVar193._12_2_ = uVar90;
  auVar193._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar51 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar51;
  auVar192._10_2_ = uVar90;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar90;
  auVar191._0_8_ = uVar51;
  uVar90 = (undefined2)(uVar51 >> 0x10);
  auVar40._4_8_ = auVar191._8_8_;
  auVar40._2_2_ = uVar90;
  auVar40._0_2_ = uVar90;
  auVar194._0_4_ = ((float)(int)(short)uVar51 - fVar151) * fVar60;
  auVar194._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar165) * fVar93;
  auVar194._8_4_ = ((float)(auVar191._8_4_ >> 0x10) - fVar166) * fVar109;
  auVar194._12_4_ = ((float)(auVar192._12_4_ >> 0x10) - fVar130) * fVar128;
  auVar156._8_4_ = auVar146._8_4_;
  auVar156._0_8_ = auVar146._0_8_;
  auVar156._12_4_ = auVar146._12_4_;
  auVar157 = minps(auVar156,auVar169);
  auVar112._8_4_ = auVar99._8_4_;
  auVar112._0_8_ = auVar99._0_8_;
  auVar112._12_4_ = auVar99._12_4_;
  auVar68 = minps(auVar112,auVar202);
  auVar157 = maxps(auVar157,auVar68);
  auVar113._8_4_ = auVar81._8_4_;
  auVar113._0_8_ = auVar81._0_8_;
  auVar113._12_4_ = auVar81._12_4_;
  auVar68 = minps(auVar113,auVar194);
  auVar131._4_4_ = uVar6;
  auVar131._0_4_ = uVar6;
  auVar131._8_4_ = uVar6;
  auVar131._12_4_ = uVar6;
  auVar68 = maxps(auVar68,auVar131);
  auVar158 = maxps(auVar157,auVar68);
  auVar157 = maxps(auVar146,auVar169);
  auVar68 = maxps(auVar99,auVar202);
  auVar157 = minps(auVar157,auVar68);
  local_2c8 = auVar158._0_4_ * 0.99999964;
  fStack_2c4 = auVar158._4_4_ * 0.99999964;
  fStack_2c0 = auVar158._8_4_ * 0.99999964;
  fStack_2bc = auVar158._12_4_ * 0.99999964;
  auVar68 = maxps(auVar81,auVar194);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar6;
  auVar100._0_4_ = uVar6;
  auVar100._8_4_ = uVar6;
  auVar100._12_4_ = uVar6;
  auVar68 = minps(auVar68,auVar100);
  auVar68 = minps(auVar157,auVar68);
  auVar101._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_2c8 <= auVar68._0_4_ * 1.0000004);
  auVar101._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_2c4 <= auVar68._4_4_ * 1.0000004);
  auVar101._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_2c0 <= auVar68._8_4_ * 1.0000004);
  auVar101._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_2bc <= auVar68._12_4_ * 1.0000004);
  uVar53 = movmskps((uint)(byte)PVar5,auVar101);
  if (uVar53 == 0) {
    return;
  }
  uVar53 = uVar53 & 0xff;
  local_268._0_12_ = mm_lookupmask_ps._240_12_;
  local_268._12_4_ = 0;
  local_430 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00b70039:
  uVar51 = (ulong)uVar53;
  lVar11 = 0;
  if (uVar51 != 0) {
    for (; (uVar53 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  uVar53 = *(uint *)(prim + 2);
  pRVar49 = (RTCIntersectArguments *)(ulong)uVar53;
  uVar54 = *(uint *)(prim + lVar11 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[(long)pRVar49].ptr;
  pRVar48 = *(RTCIntersectArguments **)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar50 = (ulong)*(RTCRayQueryFlags *)((long)&pRVar48->flags + _Var8 * uVar54);
  p_Var44 = pGVar7[1].intersectionFilterN;
  pvVar9 = pGVar7[2].userPtr;
  _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(_Var10 + uVar50 * (long)pvVar9);
  fVar129 = *pfVar3;
  fVar59 = pfVar3[1];
  fVar60 = pfVar3[2];
  fVar91 = pfVar3[3];
  puVar4 = (undefined8 *)(_Var10 + (uVar50 + 1) * (long)pvVar9);
  uVar21 = *puVar4;
  uVar23 = puVar4[1];
  local_548 = (float)uVar21;
  fStack_544 = (float)((ulong)uVar21 >> 0x20);
  fStack_540 = (float)uVar23;
  fStack_53c = (float)((ulong)uVar23 >> 0x20);
  pfVar3 = (float *)(_Var10 + (uVar50 + 2) * (long)pvVar9);
  fVar92 = *pfVar3;
  fVar93 = pfVar3[1];
  fVar94 = pfVar3[2];
  fVar95 = pfVar3[3];
  pfVar3 = (float *)(_Var10 + (long)pvVar9 * (uVar50 + 3));
  fVar109 = *pfVar3;
  fVar110 = pfVar3[1];
  fVar111 = pfVar3[2];
  fVar128 = pfVar3[3];
  uVar51 = uVar51 - 1 & uVar51;
  lVar11 = *(long *)&pGVar7[1].time_range.upper;
  pauVar1 = (undefined1 (*) [12])(lVar11 + (long)p_Var44 * uVar50);
  auVar26 = *pauVar1;
  fVar144 = *(float *)pauVar1[1];
  pfVar3 = (float *)(lVar11 + (long)p_Var44 * (uVar50 + 1));
  fVar149 = *pfVar3;
  fVar150 = pfVar3[1];
  fVar167 = pfVar3[2];
  fVar151 = pfVar3[3];
  pfVar3 = (float *)(lVar11 + (long)p_Var44 * (uVar50 + 2));
  fVar165 = *pfVar3;
  fVar166 = pfVar3[1];
  fVar130 = pfVar3[2];
  fVar142 = pfVar3[3];
  lVar12 = 0;
  if (uVar51 != 0) {
    for (; (uVar51 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
    }
  }
  pfVar3 = (float *)(lVar11 + (long)p_Var44 * (uVar50 + 3));
  fVar143 = *pfVar3;
  fVar178 = pfVar3[1];
  fVar179 = pfVar3[2];
  fVar180 = pfVar3[3];
  if ((uVar51 != 0) && (uVar50 = uVar51 - 1 & uVar51, uVar50 != 0)) {
    lVar11 = 0;
    if (uVar50 != 0) {
      for (; (uVar50 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
      }
    }
    pRVar48 = (RTCIntersectArguments *)
              (ulong)*(RTCRayQueryFlags *)
                      ((long)&pRVar48->flags + _Var8 * *(uint *)(prim + lVar11 * 4 + 6));
  }
  local_1b8 = *(float *)(ray + k * 4);
  fStack_1b4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1b0 = *(float *)(ray + k * 4 + 0x20);
  fVar213 = (fVar165 * 0.5 + fVar143 * 0.0 + fVar149 * 0.0) - *(float *)*pauVar1 * 0.5;
  fVar214 = (fVar166 * 0.5 + fVar178 * 0.0 + fVar150 * 0.0) - *(float *)(*pauVar1 + 4) * 0.5;
  fVar221 = (fVar130 * 0.5 + fVar179 * 0.0 + fVar167 * 0.0) - *(float *)(*pauVar1 + 8) * 0.5;
  fVar222 = (fVar142 * 0.5 + fVar180 * 0.0 + fVar151 * 0.0) - fVar144 * 0.5;
  fVar239 = (fVar92 * 0.5 + fVar109 * 0.0 + local_548 * 0.0) - fVar129 * 0.5;
  fVar241 = (fVar93 * 0.5 + fVar110 * 0.0 + fStack_544 * 0.0) - fVar59 * 0.5;
  fVar243 = (fVar94 * 0.5 + fVar111 * 0.0 + fStack_540 * 0.0) - fVar60 * 0.5;
  fVar245 = (fVar95 * 0.5 + fVar128 * 0.0 + fStack_53c * 0.0) - fVar91 * 0.5;
  fVar223 = *(float *)*pauVar1 * -0.0;
  fVar228 = *(float *)(*pauVar1 + 4) * -0.0;
  fVar229 = *(float *)(*pauVar1 + 8) * -0.0;
  fVar199 = fVar165 * 0.0 + fVar143 * -0.0 + fVar149 + fVar223;
  fVar200 = fVar166 * 0.0 + fVar178 * -0.0 + fVar150 + fVar228;
  fVar201 = fVar130 * 0.0 + fVar179 * -0.0 + fVar167 + fVar229;
  fVar212 = fVar142 * 0.0 + fVar180 * -0.0 + fVar151 + fVar144 * -0.0;
  fVar223 = fVar143 * -0.0 + fVar165 + fVar149 * 0.0 + fVar223;
  fVar228 = fVar178 * -0.0 + fVar166 + fVar150 * 0.0 + fVar228;
  fVar229 = fVar179 * -0.0 + fVar130 + fVar167 * 0.0 + fVar229;
  fVar230 = fVar180 * -0.0 + fVar142 + fVar151 * 0.0 + fVar144 * -0.0;
  fVar253 = fVar92 * 0.0 + fVar109 * -0.0 + local_548 + fVar129 * -0.0;
  fVar255 = fVar93 * 0.0 + fVar110 * -0.0 + fStack_544 + fVar59 * -0.0;
  fVar273 = fVar94 * 0.0 + fVar111 * -0.0 + fStack_540 + fVar60 * -0.0;
  fVar275 = fVar95 * 0.0 + fVar128 * -0.0 + fStack_53c + fVar91 * -0.0;
  local_508 = auVar26._0_4_;
  fStack_504 = auVar26._4_4_;
  fStack_500 = auVar26._8_4_;
  fVar149 = local_508 * 0.0 + ((fVar143 * 0.5 + fVar165 * 0.0) - fVar149 * 0.5);
  fVar150 = fStack_504 * 0.0 + ((fVar178 * 0.5 + fVar166 * 0.0) - fVar150 * 0.5);
  fVar167 = fStack_500 * 0.0 + ((fVar179 * 0.5 + fVar130 * 0.0) - fVar167 * 0.5);
  fVar144 = fVar144 * 0.0 + ((fVar180 * 0.5 + fVar142 * 0.0) - fVar151 * 0.5);
  fVar151 = fVar109 * -0.0 + fVar92 + local_548 * 0.0 + fVar129 * -0.0;
  fVar165 = fVar110 * -0.0 + fVar93 + fStack_544 * 0.0 + fVar59 * -0.0;
  fVar166 = fVar111 * -0.0 + fVar94 + fStack_540 * 0.0 + fVar60 * -0.0;
  fVar130 = fVar128 * -0.0 + fVar95 + fStack_53c * 0.0 + fVar91 * -0.0;
  fVar129 = fVar129 * 0.0 + ((fVar109 * 0.5 + fVar92 * 0.0) - local_548 * 0.5);
  fVar59 = fVar59 * 0.0 + ((fVar110 * 0.5 + fVar93 * 0.0) - fStack_544 * 0.5);
  fVar92 = fVar60 * 0.0 + ((fVar111 * 0.5 + fVar94 * 0.0) - fStack_540 * 0.5);
  fVar142 = fVar91 * 0.0 + ((fVar128 * 0.5 + fVar95 * 0.0) - fStack_53c * 0.5);
  fVar251 = fVar214 * fVar253 - fVar255 * fVar213;
  fVar180 = fVar221 * fVar255 - fVar273 * fVar214;
  fVar253 = fVar213 * fVar273 - fVar253 * fVar221;
  fVar255 = fVar222 * fVar275 - fVar275 * fVar222;
  fVar94 = fVar214 * fVar239 - fVar241 * fVar213;
  fVar109 = fVar221 * fVar241 - fVar243 * fVar214;
  fVar110 = fVar213 * fVar243 - fVar239 * fVar221;
  fVar111 = fVar150 * fVar151 - fVar165 * fVar149;
  fVar165 = fVar167 * fVar165 - fVar166 * fVar150;
  fVar151 = fVar149 * fVar166 - fVar151 * fVar167;
  fVar166 = fVar144 * fVar130 - fVar130 * fVar144;
  fVar60 = fVar150 * fVar129 - fVar59 * fVar149;
  fVar59 = fVar167 * fVar59 - fVar92 * fVar150;
  fVar92 = fVar149 * fVar92 - fVar129 * fVar167;
  fVar143 = fVar253 * fVar253 + fVar180 * fVar180 + fVar251 * fVar251;
  auVar157 = ZEXT416((uint)fVar143);
  auVar68 = rsqrtss(ZEXT416((uint)fVar143),auVar157);
  fVar129 = auVar68._0_4_;
  fVar178 = fVar129 * 1.5 - fVar129 * fVar129 * fVar143 * 0.5 * fVar129;
  fVar243 = fVar251 * fVar94 + fVar253 * fVar110 + fVar180 * fVar109;
  fVar129 = fVar255 * fVar178;
  auVar68 = rcpss(auVar157,auVar157);
  fVar95 = (2.0 - fVar143 * auVar68._0_4_) * auVar68._0_4_;
  fVar130 = fVar151 * fVar151 + fVar165 * fVar165 + fVar111 * fVar111;
  auVar68 = ZEXT416((uint)fVar130);
  auVar157 = rsqrtss(ZEXT416((uint)fVar130),auVar68);
  fVar91 = auVar157._0_4_;
  fVar128 = fVar91 * 1.5 - fVar91 * fVar91 * fVar130 * 0.5 * fVar91;
  fVar179 = fVar111 * fVar60 + fVar151 * fVar92 + fVar165 * fVar59;
  fVar93 = fVar166 * fVar128;
  auVar68 = rcpss(auVar68,auVar68);
  fVar91 = (2.0 - fVar130 * auVar68._0_4_) * auVar68._0_4_;
  local_3b8 = fVar212 * fVar180 * fVar178;
  fStack_3b4 = fVar212 * fVar253 * fVar178;
  fStack_3b0 = fVar212 * fVar251 * fVar178;
  fStack_3ac = fVar212 * fVar129;
  local_3c8 = fVar199 - local_3b8;
  fStack_3c4 = fVar200 - fStack_3b4;
  fStack_3c0 = fVar201 - fStack_3b0;
  fStack_3bc = fVar212 - fStack_3ac;
  fVar180 = fVar212 * fVar95 * (fVar143 * fVar109 - fVar243 * fVar180) * fVar178 +
            fVar222 * fVar180 * fVar178;
  fVar239 = fVar212 * fVar95 * (fVar143 * fVar110 - fVar243 * fVar253) * fVar178 +
            fVar222 * fVar253 * fVar178;
  fVar241 = fVar212 * fVar95 * (fVar143 * fVar94 - fVar243 * fVar251) * fVar178 +
            fVar222 * fVar251 * fVar178;
  fVar243 = fVar212 * fVar95 * (fVar143 * (fVar222 * fVar245 - fVar245 * fVar222) -
                               fVar243 * fVar255) * fVar178 + fVar222 * fVar129;
  local_3b8 = local_3b8 + fVar199;
  fStack_3b4 = fStack_3b4 + fVar200;
  fStack_3b0 = fStack_3b0 + fVar201;
  fStack_3ac = fStack_3ac + fVar212;
  fVar94 = fVar230 * fVar165 * fVar128;
  fVar95 = fVar230 * fVar151 * fVar128;
  fVar109 = fVar230 * fVar111 * fVar128;
  fVar110 = fVar230 * fVar93;
  local_3e8 = fVar223 - fVar94;
  fStack_3e4 = fVar228 - fVar95;
  fStack_3e0 = fVar229 - fVar109;
  fStack_3dc = fVar230 - fVar110;
  fVar129 = fVar230 * fVar91 * (fVar130 * fVar59 - fVar179 * fVar165) * fVar128 +
            fVar144 * fVar165 * fVar128;
  fVar59 = fVar230 * fVar91 * (fVar130 * fVar92 - fVar179 * fVar151) * fVar128 +
           fVar144 * fVar151 * fVar128;
  fVar60 = fVar230 * fVar91 * (fVar130 * fVar60 - fVar179 * fVar111) * fVar128 +
           fVar144 * fVar111 * fVar128;
  fVar91 = fVar230 * fVar91 * (fVar130 * (fVar144 * fVar142 - fVar142 * fVar144) - fVar179 * fVar166
                              ) * fVar128 + fVar144 * fVar93;
  fVar94 = fVar94 + fVar223;
  fVar95 = fVar95 + fVar228;
  fVar109 = fVar109 + fVar229;
  fVar110 = fVar110 + fVar230;
  local_3d8 = (fVar213 - fVar180) * 0.33333334 + local_3c8;
  fStack_3d4 = (fVar214 - fVar239) * 0.33333334 + fStack_3c4;
  fStack_3d0 = (fVar221 - fVar241) * 0.33333334 + fStack_3c0;
  fStack_3cc = (fVar222 - fVar243) * 0.33333334 + fStack_3bc;
  local_3f8 = local_3e8 - (fVar149 - fVar129) * 0.33333334;
  fStack_3f4 = fStack_3e4 - (fVar150 - fVar59) * 0.33333334;
  fStack_3f0 = fStack_3e0 - (fVar167 - fVar60) * 0.33333334;
  fStack_3ec = fStack_3dc - (fVar144 - fVar91) * 0.33333334;
  fVar149 = fVar94 - (fVar129 + fVar149) * 0.33333334;
  fVar150 = fVar95 - (fVar59 + fVar150) * 0.33333334;
  fVar151 = fVar109 - (fVar60 + fVar167) * 0.33333334;
  fVar165 = fVar110 - (fVar91 + fVar144) * 0.33333334;
  local_148 = local_3c8 - local_1b8;
  fStack_144 = fStack_3c4 - fStack_1b4;
  fStack_140 = fStack_3c0 - fStack_1b0;
  fStack_13c = fStack_3bc - 0.0;
  fVar129 = pre->ray_space[k].vx.field_0.m128[0];
  fVar59 = pre->ray_space[k].vx.field_0.m128[1];
  fVar60 = pre->ray_space[k].vy.field_0.m128[0];
  fVar91 = pre->ray_space[k].vy.field_0.m128[1];
  fVar92 = pre->ray_space[k].vz.field_0.m128[0];
  fVar93 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = local_148 * fVar129 + fStack_144 * fVar60 + fStack_140 * fVar92;
  fVar200 = local_148 * fVar59 + fStack_144 * fVar91 + fStack_140 * fVar93;
  local_308 = CONCAT44(fVar200,fVar199);
  local_158 = local_3d8 - local_1b8;
  fStack_154 = fStack_3d4 - fStack_1b4;
  fStack_150 = fStack_3d0 - fStack_1b0;
  fStack_14c = fStack_3cc - 0.0;
  fVar201 = local_158 * fVar129 + fStack_154 * fVar60 + fStack_150 * fVar92;
  fVar212 = local_158 * fVar59 + fStack_154 * fVar91 + fStack_150 * fVar93;
  local_318 = CONCAT44(fVar212,fVar201);
  local_168 = local_3f8 - local_1b8;
  fStack_164 = fStack_3f4 - fStack_1b4;
  fStack_160 = fStack_3f0 - fStack_1b0;
  fStack_15c = fStack_3ec - 0.0;
  fVar142 = local_168 * fVar129 + fStack_164 * fVar60 + fStack_160 * fVar92;
  fVar143 = local_168 * fVar59 + fStack_164 * fVar91 + fStack_160 * fVar93;
  local_328 = CONCAT44(fVar143,fVar142);
  local_178 = local_3e8 - local_1b8;
  fStack_174 = fStack_3e4 - fStack_1b4;
  fStack_170 = fStack_3e0 - fStack_1b0;
  fStack_16c = fStack_3dc - 0.0;
  fVar166 = local_178 * fVar129 + fStack_174 * fVar60 + fStack_170 * fVar92;
  fVar130 = local_178 * fVar59 + fStack_174 * fVar91 + fStack_170 * fVar93;
  local_338 = CONCAT44(fVar130,fVar166);
  local_188 = local_3b8 - local_1b8;
  fStack_184 = fStack_3b4 - fStack_1b4;
  fStack_180 = fStack_3b0 - fStack_1b0;
  fStack_17c = fStack_3ac - 0.0;
  fVar178 = local_188 * fVar129 + fStack_184 * fVar60 + fStack_180 * fVar92;
  fVar179 = local_188 * fVar59 + fStack_184 * fVar91 + fStack_180 * fVar93;
  local_278 = (fVar180 + fVar213) * 0.33333334 + local_3b8;
  fStack_274 = (fVar239 + fVar214) * 0.33333334 + fStack_3b4;
  fStack_270 = (fVar241 + fVar221) * 0.33333334 + fStack_3b0;
  fStack_26c = (fVar243 + fVar222) * 0.33333334 + fStack_3ac;
  local_198 = local_278 - local_1b8;
  fStack_194 = fStack_274 - fStack_1b4;
  fStack_190 = fStack_270 - fStack_1b0;
  fStack_18c = fStack_26c - 0.0;
  fVar144 = local_198 * fVar129 + fStack_194 * fVar60 + fStack_190 * fVar92;
  fVar167 = local_198 * fVar59 + fStack_194 * fVar91 + fStack_190 * fVar93;
  local_358 = CONCAT44(fVar167,fVar144);
  local_1a8 = fVar149 - local_1b8;
  fStack_1a4 = fVar150 - fStack_1b4;
  fStack_1a0 = fVar151 - fStack_1b0;
  fStack_19c = fVar165 - 0.0;
  fVar111 = local_1a8 * fVar129 + fStack_1a4 * fVar60 + fStack_1a0 * fVar92;
  fVar128 = local_1a8 * fVar59 + fStack_1a4 * fVar91 + fStack_1a0 * fVar93;
  local_1b8 = fVar94 - local_1b8;
  fStack_1b4 = fVar95 - fStack_1b4;
  fStack_1b0 = fVar109 - fStack_1b0;
  fStack_1ac = fVar110 - 0.0;
  fVar60 = local_1b8 * fVar129 + fStack_1b4 * fVar60 + fStack_1b0 * fVar92;
  fVar59 = local_1b8 * fVar59 + fStack_1b4 * fVar91 + fStack_1b0 * fVar93;
  local_378 = CONCAT44(fVar59,fVar60);
  auVar258._8_8_ = local_358;
  auVar258._0_8_ = local_318;
  auVar195._8_8_ = local_378;
  auVar195._0_8_ = local_338;
  auVar82._8_4_ = fVar178;
  auVar82._0_8_ = local_308;
  auVar82._12_4_ = fVar179;
  auVar68 = minps(auVar82,auVar258);
  auVar102._8_4_ = fVar111;
  auVar102._0_8_ = local_328;
  auVar102._12_4_ = fVar128;
  auVar157 = minps(auVar102,auVar195);
  auVar68 = minps(auVar68,auVar157);
  auVar103._4_4_ = fVar200;
  auVar103._0_4_ = fVar199;
  auVar103._8_4_ = fVar178;
  auVar103._12_4_ = fVar179;
  auVar157 = maxps(auVar103,auVar258);
  auVar114._4_4_ = fVar143;
  auVar114._0_4_ = fVar142;
  auVar114._8_4_ = fVar111;
  auVar114._12_4_ = fVar128;
  auVar115 = maxps(auVar114,auVar195);
  auVar158 = maxps(auVar157,auVar115);
  auVar13._4_8_ = auVar115._8_8_;
  auVar13._0_4_ = auVar68._4_4_;
  auVar116._0_8_ = auVar13._0_8_ << 0x20;
  auVar116._8_4_ = auVar68._8_4_;
  auVar116._12_4_ = auVar68._12_4_;
  auVar117._8_8_ = auVar68._8_8_;
  auVar117._0_8_ = auVar116._8_8_;
  auVar157 = minps(auVar68,auVar117);
  auVar14._4_8_ = auVar68._8_8_;
  auVar14._0_4_ = auVar158._4_4_;
  auVar118._0_8_ = auVar14._0_8_ << 0x20;
  auVar118._8_4_ = auVar158._8_4_;
  auVar118._12_4_ = auVar158._12_4_;
  auVar119._8_8_ = auVar158._8_8_;
  auVar119._0_8_ = auVar118._8_8_;
  auVar68 = maxps(auVar158,auVar119);
  auVar83._0_8_ = auVar157._0_8_ & 0x7fffffff7fffffff;
  auVar83._8_4_ = auVar157._8_4_ & 0x7fffffff;
  auVar83._12_4_ = auVar157._12_4_ & 0x7fffffff;
  auVar104._0_8_ = auVar68._0_8_ & 0x7fffffff7fffffff;
  auVar104._8_4_ = auVar68._8_4_ & 0x7fffffff;
  auVar104._12_4_ = auVar68._12_4_ & 0x7fffffff;
  auVar68 = maxps(auVar83,auVar104);
  fVar129 = auVar68._4_4_;
  if (auVar68._4_4_ <= auVar68._0_4_) {
    fVar129 = auVar68._0_4_;
  }
  fVar129 = fVar129 * 9.536743e-07;
  local_248 = fVar129;
  fStack_244 = fVar129;
  fStack_240 = fVar129;
  fStack_23c = fVar129;
  local_258 = -fVar129;
  fStack_254 = -fVar129;
  fStack_250 = -fVar129;
  fStack_24c = -fVar129;
  local_118 = fVar201 - fVar199;
  fStack_114 = fVar212 - fVar200;
  fStack_110 = fVar144 - fVar178;
  fStack_10c = fVar167 - fVar179;
  local_128 = fVar142 - fVar201;
  fStack_124 = fVar143 - fVar212;
  fStack_120 = fVar111 - fVar144;
  fStack_11c = fVar128 - fVar167;
  local_138 = fVar166 - fVar142;
  fStack_134 = fVar130 - fVar143;
  fStack_130 = fVar60 - fVar111;
  fStack_12c = fVar59 - fVar128;
  local_288 = local_3b8 - local_3c8;
  fStack_284 = fStack_3b4 - fStack_3c4;
  fStack_280 = fStack_3b0 - fStack_3c0;
  fStack_27c = fStack_3ac - fStack_3bc;
  local_298 = local_278 - local_3d8;
  fStack_294 = fStack_274 - fStack_3d4;
  fStack_290 = fStack_270 - fStack_3d0;
  fStack_28c = fStack_26c - fStack_3cc;
  local_2a8 = fVar149 - local_3f8;
  fStack_2a4 = fVar150 - fStack_3f4;
  fStack_2a0 = fVar151 - fStack_3f0;
  fStack_29c = fVar165 - fStack_3ec;
  local_2b8 = fVar94 - local_3e8;
  fStack_2b4 = fVar95 - fStack_3e4;
  fStack_2b0 = fVar109 - fStack_3e0;
  fStack_2ac = fVar110 - fStack_3dc;
  local_2d8 = uVar53;
  uStack_2d4 = uVar53;
  uStack_2d0 = uVar53;
  uStack_2cc = uVar53;
  local_2e8 = uVar54;
  uStack_2e4 = uVar54;
  uStack_2e0 = uVar54;
  uStack_2dc = uVar54;
  uVar50 = 0;
  fVar91 = *(float *)(ray + k * 4 + 0x30);
  local_528 = 0x3f80000000000000;
  local_518 = 0x3f80000000000000;
  uStack_370 = local_378;
  uStack_350 = local_358;
  uStack_330 = local_338;
  uStack_320 = local_328;
  uStack_310 = local_318;
  uStack_300 = local_308;
  local_348 = fVar178;
  fStack_344 = fVar179;
  fStack_340 = fVar178;
  fStack_33c = fVar179;
  local_368 = fVar111;
  fStack_364 = fVar128;
  fStack_360 = fVar111;
  fStack_35c = fVar128;
  do {
    fVar92 = 1.0 - (float)local_528;
    fVar93 = 1.0 - (float)local_528;
    fVar110 = 1.0 - local_528._4_4_;
    fVar149 = 1.0 - local_528._4_4_;
    fVar150 = (float)local_308 * fVar92 + local_348 * (float)local_528;
    fVar228 = local_308._4_4_ * fVar93 + fStack_344 * (float)local_528;
    fVar230 = (float)uStack_300 * fVar110 + fStack_340 * local_528._4_4_;
    fVar243 = uStack_300._4_4_ * fVar149 + fStack_33c * local_528._4_4_;
    fVar221 = (float)local_318 * fVar92 + (float)local_358 * (float)local_528;
    fVar239 = local_318._4_4_ * fVar93 + local_358._4_4_ * (float)local_528;
    fVar273 = (float)uStack_310 * fVar110 + (float)uStack_350 * local_528._4_4_;
    fVar275 = uStack_310._4_4_ * fVar149 + uStack_350._4_4_ * local_528._4_4_;
    fVar253 = (float)local_328 * fVar92 + local_368 * (float)local_528;
    fVar255 = local_328._4_4_ * fVar93 + fStack_364 * (float)local_528;
    fVar242 = (float)uStack_320 * fVar110 + fStack_360 * local_528._4_4_;
    fVar244 = uStack_320._4_4_ * fVar149 + fStack_35c * local_528._4_4_;
    fVar265 = fVar92 * (float)local_338 + (float)local_528 * (float)local_378;
    fVar272 = fVar93 * local_338._4_4_ + (float)local_528 * local_378._4_4_;
    fVar274 = fVar110 * (float)uStack_330 + local_528._4_4_ * (float)uStack_370;
    fVar276 = fVar149 * uStack_330._4_4_ + local_528._4_4_ * uStack_370._4_4_;
    fVar92 = (local_518._4_4_ - (float)local_518) * 0.11111111;
    fVar246 = (local_518._4_4_ - (float)local_518) * 0.0 + (float)local_518;
    fVar252 = (local_518._4_4_ - (float)local_518) * 0.33333334 + (float)local_518;
    fVar254 = (local_518._4_4_ - (float)local_518) * 0.6666667 + (float)local_518;
    fVar256 = (local_518._4_4_ - (float)local_518) * 1.0 + (float)local_518;
    fVar257 = 1.0 - fVar246;
    fVar262 = 1.0 - fVar252;
    fVar263 = 1.0 - fVar254;
    fVar264 = 1.0 - fVar256;
    fVar165 = fVar221 * fVar257 + fVar253 * fVar246;
    fVar180 = fVar221 * fVar262 + fVar253 * fVar252;
    fVar213 = fVar221 * fVar263 + fVar253 * fVar254;
    fVar214 = fVar221 * fVar264 + fVar253 * fVar256;
    fVar229 = fVar239 * fVar257 + fVar255 * fVar246;
    fVar241 = fVar239 * fVar262 + fVar255 * fVar252;
    fVar245 = fVar239 * fVar263 + fVar255 * fVar254;
    fVar251 = fVar239 * fVar264 + fVar255 * fVar256;
    fVar93 = (fVar150 * fVar257 + fVar221 * fVar246) * fVar257 + fVar246 * fVar165;
    fVar110 = (fVar150 * fVar262 + fVar221 * fVar252) * fVar262 + fVar252 * fVar180;
    fVar149 = (fVar150 * fVar263 + fVar221 * fVar254) * fVar263 + fVar254 * fVar213;
    fVar150 = (fVar150 * fVar264 + fVar221 * fVar256) * fVar264 + fVar256 * fVar214;
    fVar221 = (fVar228 * fVar257 + fVar239 * fVar246) * fVar257 + fVar246 * fVar229;
    fVar222 = (fVar228 * fVar262 + fVar239 * fVar252) * fVar262 + fVar252 * fVar241;
    fVar223 = (fVar228 * fVar263 + fVar239 * fVar254) * fVar263 + fVar254 * fVar245;
    fVar228 = (fVar228 * fVar264 + fVar239 * fVar256) * fVar264 + fVar256 * fVar251;
    fVar165 = fVar165 * fVar257 + (fVar253 * fVar257 + fVar265 * fVar246) * fVar246;
    fVar180 = fVar180 * fVar262 + (fVar253 * fVar262 + fVar265 * fVar252) * fVar252;
    fVar213 = fVar213 * fVar263 + (fVar253 * fVar263 + fVar265 * fVar254) * fVar254;
    fVar214 = fVar214 * fVar264 + (fVar253 * fVar264 + fVar265 * fVar256) * fVar256;
    fVar239 = fVar229 * fVar257 + (fVar255 * fVar257 + fVar272 * fVar246) * fVar246;
    fVar229 = fVar241 * fVar262 + (fVar255 * fVar262 + fVar272 * fVar252) * fVar252;
    fVar241 = fVar245 * fVar263 + (fVar255 * fVar263 + fVar272 * fVar254) * fVar254;
    fVar245 = fVar251 * fVar264 + (fVar255 * fVar264 + fVar272 * fVar256) * fVar256;
    local_3a8 = fVar257 * fVar93 + fVar246 * fVar165;
    fStack_3a4 = fVar262 * fVar110 + fVar252 * fVar180;
    fStack_3a0 = fVar263 * fVar149 + fVar254 * fVar213;
    fStack_39c = fVar264 * fVar150 + fVar256 * fVar214;
    local_398 = fVar257 * fVar221 + fVar246 * fVar239;
    fStack_394 = fVar262 * fVar222 + fVar252 * fVar229;
    fStack_390 = fVar263 * fVar223 + fVar254 * fVar241;
    fStack_38c = fVar264 * fVar228 + fVar256 * fVar245;
    fVar180 = (fVar180 - fVar110) * 3.0 * fVar92;
    fVar149 = (fVar213 - fVar149) * 3.0 * fVar92;
    fVar150 = (fVar214 - fVar150) * 3.0 * fVar92;
    fVar214 = (fVar229 - fVar222) * 3.0 * fVar92;
    fVar241 = (fVar241 - fVar223) * 3.0 * fVar92;
    fVar228 = (fVar245 - fVar228) * 3.0 * fVar92;
    local_1e8._4_4_ = fStack_3a0;
    local_1e8._0_4_ = fStack_3a4;
    local_1c8._4_4_ = fStack_390;
    local_1c8._0_4_ = fStack_394;
    fVar213 = local_3a8 + (fVar165 - fVar93) * 3.0 * fVar92;
    fVar222 = fStack_3a4 + fVar180;
    fVar223 = fStack_3a0 + fVar149;
    fVar229 = fStack_39c + fVar150;
    fVar93 = local_398 + (fVar239 - fVar221) * 3.0 * fVar92;
    fVar110 = fStack_394 + fVar214;
    fStack_540 = fStack_390 + fVar241;
    fStack_53c = fStack_38c + fVar228;
    local_388._0_4_ = fStack_3a4 - fVar180;
    local_388._4_4_ = fStack_3a0 - fVar149;
    local_388._8_4_ = fStack_39c - fVar150;
    local_388._12_4_ = 0;
    local_1c8._8_4_ = fStack_38c;
    local_1c8._12_4_ = 0;
    local_1d8._0_4_ = fStack_394 - fVar214;
    local_1d8._4_4_ = fStack_390 - fVar241;
    local_1d8._8_4_ = fStack_38c - fVar228;
    local_1d8._12_4_ = 0;
    fVar149 = fVar273 * fVar257 + fVar242 * fVar246;
    fVar150 = fVar273 * fVar262 + fVar242 * fVar252;
    fVar165 = fVar273 * fVar263 + fVar242 * fVar254;
    fVar180 = fVar273 * fVar264 + fVar242 * fVar256;
    fVar214 = fVar275 * fVar257 + fVar244 * fVar246;
    fVar221 = fVar275 * fVar262 + fVar244 * fVar252;
    fVar228 = fVar275 * fVar263 + fVar244 * fVar254;
    fVar272 = fVar275 * fVar264 + fVar244 * fVar256;
    fVar251 = (fVar230 * fVar257 + fVar273 * fVar246) * fVar257 + fVar246 * fVar149;
    fVar253 = (fVar230 * fVar262 + fVar273 * fVar252) * fVar262 + fVar252 * fVar150;
    fVar255 = (fVar230 * fVar263 + fVar273 * fVar254) * fVar263 + fVar254 * fVar165;
    fVar273 = (fVar230 * fVar264 + fVar273 * fVar256) * fVar264 + fVar256 * fVar180;
    fVar245 = (fVar243 * fVar257 + fVar275 * fVar246) * fVar257 + fVar246 * fVar214;
    fVar239 = (fVar243 * fVar262 + fVar275 * fVar252) * fVar262 + fVar252 * fVar221;
    fVar241 = (fVar243 * fVar263 + fVar275 * fVar254) * fVar263 + fVar254 * fVar228;
    fVar243 = (fVar243 * fVar264 + fVar275 * fVar256) * fVar264 + fVar256 * fVar272;
    fVar149 = fVar149 * fVar257 + (fVar242 * fVar257 + fVar274 * fVar246) * fVar246;
    fVar150 = fVar150 * fVar262 + (fVar242 * fVar262 + fVar274 * fVar252) * fVar252;
    fVar165 = fVar165 * fVar263 + (fVar242 * fVar263 + fVar274 * fVar254) * fVar254;
    fVar180 = fVar180 * fVar264 + (fVar242 * fVar264 + fVar274 * fVar256) * fVar256;
    fVar275 = fVar214 * fVar257 + (fVar244 * fVar257 + fVar276 * fVar246) * fVar246;
    fVar242 = fVar221 * fVar262 + (fVar244 * fVar262 + fVar276 * fVar252) * fVar252;
    fVar265 = fVar228 * fVar263 + (fVar244 * fVar263 + fVar276 * fVar254) * fVar254;
    fVar272 = fVar272 * fVar264 + (fVar244 * fVar264 + fVar276 * fVar256) * fVar256;
    fVar214 = fVar257 * fVar251 + fVar246 * fVar149;
    fVar221 = fVar262 * fVar253 + fVar252 * fVar150;
    fVar228 = fVar263 * fVar255 + fVar254 * fVar165;
    fVar230 = fVar264 * fVar273 + fVar256 * fVar180;
    fVar244 = fVar257 * fVar245 + fVar246 * fVar275;
    fVar246 = fVar262 * fVar239 + fVar252 * fVar242;
    fVar252 = fVar263 * fVar241 + fVar254 * fVar265;
    fVar254 = fVar264 * fVar243 + fVar256 * fVar272;
    fVar150 = (fVar150 - fVar253) * 3.0 * fVar92;
    fVar165 = (fVar165 - fVar255) * 3.0 * fVar92;
    fVar180 = (fVar180 - fVar273) * 3.0 * fVar92;
    fVar253 = (fVar242 - fVar239) * 3.0 * fVar92;
    fVar255 = (fVar265 - fVar241) * 3.0 * fVar92;
    fVar273 = (fVar272 - fVar243) * 3.0 * fVar92;
    local_1f8._4_4_ = fVar228;
    local_1f8._0_4_ = fVar221;
    local_1f8._8_4_ = fVar230;
    local_1f8._12_4_ = 0;
    local_218._4_4_ = fVar252;
    local_218._0_4_ = fVar246;
    local_218._8_4_ = fVar254;
    local_218._12_4_ = 0;
    fVar149 = fVar214 + (fVar149 - fVar251) * 3.0 * fVar92;
    fVar239 = fVar221 + fVar150;
    fVar241 = fVar228 + fVar165;
    fVar243 = fVar230 + fVar180;
    local_208 = fVar244 + (fVar275 - fVar245) * 3.0 * fVar92;
    fStack_204 = fVar246 + fVar253;
    fStack_200 = fVar252 + fVar255;
    fStack_1fc = fVar254 + fVar273;
    local_238._0_4_ = fVar221 - fVar150;
    local_238._4_4_ = fVar228 - fVar165;
    local_238._8_4_ = fVar230 - fVar180;
    local_238._12_4_ = 0;
    local_228._0_4_ = fVar246 - fVar253;
    local_228._4_4_ = fVar252 - fVar255;
    local_228._8_4_ = fVar254 - fVar273;
    local_228._12_4_ = 0;
    local_1e8._8_4_ = fStack_39c;
    local_1e8._12_4_ = 0;
    fVar245 = (fVar221 - fStack_3a4) + (fVar214 - local_3a8);
    fVar251 = (fVar228 - fStack_3a0) + (fVar221 - fStack_3a4);
    fVar253 = (fVar230 - fStack_39c) + (fVar228 - fStack_3a0);
    fVar255 = (fVar230 - fStack_39c) + 0.0;
    fVar92 = (fVar246 - fStack_394) + (fVar244 - local_398);
    fVar150 = (fVar252 - fStack_390) + (fVar246 - fStack_394);
    fVar165 = (fVar254 - fStack_38c) + (fVar252 - fStack_390);
    fVar180 = (fVar254 - fStack_38c) + 0.0;
    auVar159._0_8_ =
         CONCAT44(fStack_394 * fVar251 - fStack_3a4 * fVar150,
                  local_398 * fVar245 - local_3a8 * fVar92);
    auVar159._8_4_ = fStack_390 * fVar253 - fStack_3a0 * fVar165;
    auVar159._12_4_ = fStack_38c * fVar255 - fStack_39c * fVar180;
    auVar120._0_4_ = fVar93 * fVar245 - fVar213 * fVar92;
    auVar120._4_4_ = fVar110 * fVar251 - fVar222 * fVar150;
    auVar120._8_4_ = fStack_540 * fVar253 - fVar223 * fVar165;
    auVar120._12_4_ = fStack_53c * fVar255 - fVar229 * fVar180;
    auVar132._0_8_ =
         CONCAT44(local_1d8._4_4_ * fVar251 - fVar150 * local_388._4_4_,
                  local_1d8._0_4_ * fVar245 - fVar92 * local_388._0_4_);
    auVar132._8_4_ = local_1d8._8_4_ * fVar253 - fVar165 * local_388._8_4_;
    auVar132._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
    auVar277._0_4_ = fVar245 * fStack_394 - fVar92 * fStack_3a4;
    auVar277._4_4_ = fVar251 * fStack_390 - fVar150 * fStack_3a0;
    auVar277._8_4_ = fVar253 * fStack_38c - fVar165 * fStack_39c;
    auVar277._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
    auVar84._0_8_ =
         CONCAT44(fVar246 * fVar251 - fVar221 * fVar150,fVar244 * fVar245 - fVar214 * fVar92);
    auVar84._8_4_ = fVar252 * fVar253 - fVar228 * fVar165;
    auVar84._12_4_ = fVar254 * fVar255 - fVar230 * fVar180;
    auVar236._0_4_ = local_208 * fVar245 - fVar149 * fVar92;
    auVar236._4_4_ = fStack_204 * fVar251 - fVar239 * fVar150;
    auVar236._8_4_ = fStack_200 * fVar253 - fVar241 * fVar165;
    auVar236._12_4_ = fStack_1fc * fVar255 - fVar243 * fVar180;
    auVar203._0_8_ =
         CONCAT44(local_228._4_4_ * fVar251 - fVar150 * local_238._4_4_,
                  local_228._0_4_ * fVar245 - fVar92 * local_238._0_4_);
    auVar203._8_4_ = local_228._8_4_ * fVar253 - fVar165 * local_238._8_4_;
    auVar203._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
    auVar224._0_4_ = fVar245 * fVar246 - fVar92 * fVar221;
    auVar224._4_4_ = fVar251 * fVar252 - fVar150 * fVar228;
    auVar224._8_4_ = fVar253 * fVar254 - fVar165 * fVar230;
    auVar224._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
    auVar267._8_4_ = auVar159._8_4_;
    auVar267._0_8_ = auVar159._0_8_;
    auVar267._12_4_ = auVar159._12_4_;
    auVar158 = minps(auVar267,auVar120);
    auVar157 = maxps(auVar159,auVar120);
    auVar121._8_4_ = auVar132._8_4_;
    auVar121._0_8_ = auVar132._0_8_;
    auVar121._12_4_ = auVar132._12_4_;
    auVar68 = minps(auVar121,auVar277);
    auVar268 = minps(auVar158,auVar68);
    auVar68 = maxps(auVar132,auVar277);
    auVar115 = maxps(auVar157,auVar68);
    auVar122._8_4_ = auVar84._8_4_;
    auVar122._0_8_ = auVar84._0_8_;
    auVar122._12_4_ = auVar84._12_4_;
    auVar157 = minps(auVar122,auVar236);
    auVar68 = maxps(auVar84,auVar236);
    auVar133._8_4_ = auVar203._8_4_;
    auVar133._0_8_ = auVar203._0_8_;
    auVar133._12_4_ = auVar203._12_4_;
    auVar158 = minps(auVar133,auVar224);
    auVar157 = minps(auVar157,auVar158);
    auVar158 = minps(auVar268,auVar157);
    auVar157 = maxps(auVar203,auVar224);
    auVar68 = maxps(auVar68,auVar157);
    auVar68 = maxps(auVar115,auVar68);
    auVar160._0_4_ =
         -(uint)(local_258 <= auVar68._0_4_ && auVar158._0_4_ <= local_248) & local_268._0_4_;
    auVar160._4_4_ =
         -(uint)(fStack_254 <= auVar68._4_4_ && auVar158._4_4_ <= fStack_244) & local_268._4_4_;
    auVar160._8_4_ =
         -(uint)(fStack_250 <= auVar68._8_4_ && auVar158._8_4_ <= fStack_240) & local_268._8_4_;
    auVar160._12_4_ =
         -(uint)(fStack_24c <= auVar68._12_4_ && auVar158._12_4_ <= fStack_23c) & local_268._12_4_;
    iVar46 = movmskps((int)pRVar48,auVar160);
    uVar42 = 0;
    if (iVar46 != 0) {
      fVar245 = (fVar221 - fVar214) + (fStack_3a4 - local_3a8);
      fVar251 = (fVar228 - fVar221) + (fStack_3a0 - fStack_3a4);
      fVar253 = (fVar230 - fVar228) + (fStack_39c - fStack_3a0);
      fVar255 = (0.0 - fVar230) + (0.0 - fStack_39c);
      fVar92 = (fVar246 - fVar244) + (fStack_394 - local_398);
      fVar150 = (fVar252 - fVar246) + (fStack_390 - fStack_394);
      fVar165 = (fVar254 - fVar252) + (fStack_38c - fStack_390);
      fVar180 = (0.0 - fVar254) + (0.0 - fStack_38c);
      auVar278._0_8_ =
           CONCAT44(fStack_394 * fVar251 - fStack_3a4 * fVar150,
                    local_398 * fVar245 - local_3a8 * fVar92);
      auVar278._8_4_ = fStack_390 * fVar253 - fStack_3a0 * fVar165;
      auVar278._12_4_ = fStack_38c * fVar255 - fStack_39c * fVar180;
      auVar123._0_4_ = fVar93 * fVar245 - fVar213 * fVar92;
      auVar123._4_4_ = fVar110 * fVar251 - fVar222 * fVar150;
      auVar123._8_4_ = fStack_540 * fVar253 - fVar223 * fVar165;
      auVar123._12_4_ = fStack_53c * fVar255 - fVar229 * fVar180;
      auVar196._0_8_ =
           CONCAT44(local_1d8._4_4_ * fVar251 - local_388._4_4_ * fVar150,
                    local_1d8._0_4_ * fVar245 - local_388._0_4_ * fVar92);
      auVar196._8_4_ = local_1d8._8_4_ * fVar253 - local_388._8_4_ * fVar165;
      auVar196._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
      auVar134._0_4_ = fStack_394 * fVar245 - fStack_3a4 * fVar92;
      auVar134._4_4_ = fStack_390 * fVar251 - fStack_3a0 * fVar150;
      auVar134._8_4_ = fStack_38c * fVar253 - fStack_39c * fVar165;
      auVar134._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
      auVar259._0_8_ =
           CONCAT44(fVar246 * fVar251 - fVar221 * fVar150,fVar244 * fVar245 - fVar214 * fVar92);
      auVar259._8_4_ = fVar252 * fVar253 - fVar228 * fVar165;
      auVar259._12_4_ = fVar254 * fVar255 - fVar230 * fVar180;
      auVar147._0_4_ = local_208 * fVar245 - fVar149 * fVar92;
      auVar147._4_4_ = fStack_204 * fVar251 - fVar239 * fVar150;
      auVar147._8_4_ = fStack_200 * fVar253 - fVar241 * fVar165;
      auVar147._12_4_ = fStack_1fc * fVar255 - fVar243 * fVar180;
      auVar237._0_8_ =
           CONCAT44(local_228._4_4_ * fVar251 - local_238._4_4_ * fVar150,
                    local_228._0_4_ * fVar245 - local_238._0_4_ * fVar92);
      auVar237._8_4_ = local_228._8_4_ * fVar253 - local_238._8_4_ * fVar165;
      auVar237._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
      auVar225._0_4_ = fVar245 * fVar246 - fVar92 * fVar221;
      auVar225._4_4_ = fVar251 * fVar252 - fVar150 * fVar228;
      auVar225._8_4_ = fVar253 * fVar254 - fVar165 * fVar230;
      auVar225._12_4_ = fVar255 * 0.0 - fVar180 * 0.0;
      auVar85._8_4_ = auVar278._8_4_;
      auVar85._0_8_ = auVar278._0_8_;
      auVar85._12_4_ = auVar278._12_4_;
      auVar68 = minps(auVar85,auVar123);
      auVar158 = maxps(auVar278,auVar123);
      auVar124._8_4_ = auVar196._8_4_;
      auVar124._0_8_ = auVar196._0_8_;
      auVar124._12_4_ = auVar196._12_4_;
      auVar157 = minps(auVar124,auVar134);
      auVar68 = minps(auVar68,auVar157);
      auVar157 = maxps(auVar196,auVar134);
      auVar268 = maxps(auVar158,auVar157);
      auVar125._8_4_ = auVar259._8_4_;
      auVar125._0_8_ = auVar259._0_8_;
      auVar125._12_4_ = auVar259._12_4_;
      auVar157 = minps(auVar125,auVar147);
      auVar115 = maxps(auVar259,auVar147);
      auVar135._8_4_ = auVar237._8_4_;
      auVar135._0_8_ = auVar237._0_8_;
      auVar135._12_4_ = auVar237._12_4_;
      auVar158 = minps(auVar135,auVar225);
      auVar157 = minps(auVar157,auVar158);
      auVar68 = minps(auVar68,auVar157);
      auVar157 = maxps(auVar237,auVar225);
      auVar157 = maxps(auVar115,auVar157);
      auVar157 = maxps(auVar268,auVar157);
      auVar279._0_4_ =
           -(uint)(local_258 <= auVar157._0_4_ && auVar68._0_4_ <= local_248) & auVar160._0_4_;
      auVar279._4_4_ =
           -(uint)(fStack_254 <= auVar157._4_4_ && auVar68._4_4_ <= fStack_244) & auVar160._4_4_;
      auVar279._8_4_ =
           -(uint)(fStack_250 <= auVar157._8_4_ && auVar68._8_4_ <= fStack_240) & auVar160._8_4_;
      auVar279._12_4_ =
           -(uint)(fStack_24c <= auVar157._12_4_ && auVar68._12_4_ <= fStack_23c) & auVar160._12_4_;
      uVar56 = movmskps(0,auVar279);
      uVar42 = (ulong)uVar56;
    }
    if ((uint)uVar42 != 0) {
      auStack_2f8[uVar50] = (uint)uVar42;
      *(undefined8 *)(afStack_108 + uVar50 * 2) = local_518;
      auStack_58[uVar50] = local_528;
      uVar50 = (ulong)((int)uVar50 + 1);
    }
    do {
      if ((int)uVar50 == 0) {
        fVar129 = *(float *)(ray + k * 4 + 0x80);
        auVar108._4_4_ = -(uint)(fStack_2c4 <= fVar129);
        auVar108._0_4_ = -(uint)(local_2c8 <= fVar129);
        auVar108._8_4_ = -(uint)(fStack_2c0 <= fVar129);
        auVar108._12_4_ = -(uint)(fStack_2bc <= fVar129);
        uVar53 = movmskps((int)uVar42,auVar108);
        uVar53 = (uint)uVar51 & uVar53;
        if (uVar53 == 0) {
          return;
        }
        goto LAB_00b70039;
      }
      uVar57 = (int)uVar50 - 1;
      uVar43 = (ulong)uVar57;
      uVar56 = auStack_2f8[uVar43];
      local_528 = auStack_58[uVar43];
      uVar42 = 0;
      if (uVar56 != 0) {
        for (; (uVar56 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
        }
      }
      uVar56 = uVar56 - 1 & uVar56;
      auStack_2f8[uVar43] = uVar56;
      if (uVar56 == 0) {
        uVar50 = (ulong)uVar57;
      }
      pRVar47 = (RTCIntersectArguments *)(uVar42 + 1);
      pRVar48 = pRVar47;
      if ((long)pRVar47 < 0) {
        pRVar48 = (RTCIntersectArguments *)((ulong)((uint)pRVar47 & 1) | (ulong)pRVar47 >> 1);
      }
      fVar92 = afStack_108[uVar43 * 2];
      fVar93 = afStack_108[uVar43 * 2 + 1];
      fVar110 = fVar92 * (1.0 - (float)uVar42 * 0.33333334) + fVar93 * (float)uVar42 * 0.33333334;
      fVar149 = fVar92 * (1.0 - (float)pRVar47 * 0.33333334) + fVar93 * (float)pRVar47 * 0.33333334;
      fVar150 = fVar92 * 0.0 + fVar93 * 0.0;
      fVar93 = fVar92 * 0.0 + fVar93 * 0.0;
      fVar92 = fVar149 - fVar110;
      local_518 = CONCAT44(fVar149,fVar110);
      if (0.16666667 <= fVar92) break;
      fVar251 = (float)local_528;
      fVar255 = (float)((ulong)local_528 >> 0x20);
      fVar165 = 1.0 - fVar251;
      fVar180 = 1.0 - fVar251;
      fVar213 = 1.0 - fVar255;
      fVar214 = 1.0 - fVar255;
      fVar239 = (float)local_308 * fVar165 + local_348 * fVar251;
      fVar241 = local_308._4_4_ * fVar180 + fStack_344 * fVar251;
      fVar243 = (float)uStack_300 * fVar213 + fStack_340 * fVar255;
      fVar245 = uStack_300._4_4_ * fVar214 + fStack_33c * fVar255;
      fVar265 = (float)local_318 * fVar165 + (float)local_358 * fVar251;
      fVar272 = local_318._4_4_ * fVar180 + local_358._4_4_ * fVar251;
      fVar244 = (float)uStack_310 * fVar213 + (float)uStack_350 * fVar255;
      fVar246 = uStack_310._4_4_ * fVar214 + uStack_350._4_4_ * fVar255;
      fVar252 = (float)local_328 * fVar165 + local_368 * fVar251;
      fVar256 = local_328._4_4_ * fVar180 + fStack_364 * fVar251;
      fVar262 = (float)uStack_320 * fVar213 + fStack_360 * fVar255;
      fVar264 = uStack_320._4_4_ * fVar214 + fStack_35c * fVar255;
      fVar253 = (fVar165 * (float)local_338 + fVar251 * (float)local_378) - fVar252;
      fVar273 = (fVar180 * local_338._4_4_ + fVar251 * local_378._4_4_) - fVar256;
      fVar275 = (fVar213 * (float)uStack_330 + fVar255 * (float)uStack_370) - fVar262;
      fVar242 = (fVar214 * uStack_330._4_4_ + fVar255 * uStack_370._4_4_) - fVar264;
      fVar165 = fVar110 * (fVar252 - fVar265) + fVar265;
      fVar180 = fVar110 * (fVar256 - fVar272) + fVar272;
      fVar213 = fVar110 * (fVar262 - fVar244) + fVar244;
      fVar214 = fVar110 * (fVar264 - fVar246) + fVar246;
      fVar254 = (fVar252 - fVar265) * fVar149 + fVar265;
      fVar257 = (fVar256 - fVar272) * fVar149 + fVar272;
      fVar263 = (fVar262 - fVar244) * fVar149 + fVar244;
      fVar274 = (fVar264 - fVar246) * fVar149 + fVar246;
      fVar221 = fVar110 * (fVar265 - fVar239) + fVar239;
      fVar222 = fVar110 * (fVar272 - fVar241) + fVar241;
      fVar228 = fVar110 * (fVar244 - fVar243) + fVar243;
      fVar230 = fVar110 * (fVar246 - fVar245) + fVar245;
      fVar221 = (fVar165 - fVar221) * fVar110 + fVar221;
      fVar222 = (fVar180 - fVar222) * fVar110 + fVar222;
      fVar228 = (fVar213 - fVar228) * fVar110 + fVar228;
      fVar230 = (fVar214 - fVar230) * fVar110 + fVar230;
      fVar165 = (((fVar110 * fVar253 + fVar252) - fVar165) * fVar110 + fVar165) - fVar221;
      fVar180 = (((fVar110 * fVar273 + fVar256) - fVar180) * fVar110 + fVar180) - fVar222;
      fVar213 = (((fVar110 * fVar275 + fVar262) - fVar213) * fVar110 + fVar213) - fVar228;
      fVar214 = (((fVar110 * fVar242 + fVar264) - fVar214) * fVar110 + fVar214) - fVar230;
      fVar221 = fVar110 * fVar165 + fVar221;
      fVar222 = fVar110 * fVar180 + fVar222;
      fVar228 = fVar110 * fVar213 + fVar228;
      fVar230 = fVar110 * fVar214 + fVar230;
      fVar239 = (fVar265 - fVar239) * fVar149 + fVar239;
      fVar241 = (fVar272 - fVar241) * fVar149 + fVar241;
      fVar243 = (fVar244 - fVar243) * fVar149 + fVar243;
      fVar245 = (fVar246 - fVar245) * fVar149 + fVar245;
      fVar239 = (fVar254 - fVar239) * fVar149 + fVar239;
      fVar241 = (fVar257 - fVar241) * fVar149 + fVar241;
      fVar243 = (fVar263 - fVar243) * fVar149 + fVar243;
      fVar245 = (fVar274 - fVar245) * fVar149 + fVar245;
      fVar265 = (((fVar253 * fVar149 + fVar252) - fVar254) * fVar149 + fVar254) - fVar239;
      fVar272 = (((fVar273 * fVar149 + fVar256) - fVar257) * fVar149 + fVar257) - fVar241;
      fVar244 = (((fVar275 * fVar149 + fVar262) - fVar263) * fVar149 + fVar263) - fVar243;
      fVar246 = (((fVar242 * fVar149 + fVar264) - fVar274) * fVar149 + fVar274) - fVar245;
      fVar239 = fVar149 * fVar265 + fVar239;
      fVar241 = fVar149 * fVar272 + fVar241;
      fVar243 = fVar149 * fVar244 + fVar243;
      fVar245 = fVar149 * fVar246 + fVar245;
      fVar252 = fVar92 * 0.33333334;
      fVar253 = fVar165 * (float)DAT_01ff0f60 * fVar252 + fVar221;
      fVar273 = fVar180 * DAT_01ff0f60._4_4_ * fVar252 + fVar222;
      fVar275 = fVar213 * DAT_01ff0f60._8_4_ * fVar252 + fVar228;
      fVar242 = fVar214 * DAT_01ff0f60._12_4_ * fVar252 + fVar230;
      fVar265 = fVar239 - fVar252 * fVar265 * (float)DAT_01ff0f60;
      fVar272 = fVar241 - fVar252 * fVar272 * DAT_01ff0f60._4_4_;
      fVar244 = fVar243 - fVar252 * fVar244 * DAT_01ff0f60._8_4_;
      fVar246 = fVar245 - fVar252 * fVar246 * DAT_01ff0f60._12_4_;
      fVar257 = (fVar243 - fVar239) + (fVar228 - fVar221);
      fVar262 = (fVar245 - fVar241) + (fVar230 - fVar222);
      auVar204._0_4_ = fVar262 * fVar241;
      auVar204._4_4_ = fVar262 * fVar241;
      auVar204._8_4_ = fVar262 * fVar245;
      auVar204._12_4_ = fVar262 * fVar245;
      fVar165 = fVar221 * fVar257 + fVar222 * fVar262;
      fVar180 = fVar228 * fVar257 + fVar230 * fVar262;
      fVar263 = fVar253 * fVar257 + fVar273 * fVar262;
      fVar264 = fVar275 * fVar257 + fVar242 * fVar262;
      fVar252 = fVar265 * fVar257 + fVar272 * fVar262;
      auVar215._4_4_ = fVar272 * fVar257 + fVar272 * fVar262;
      auVar215._0_4_ = fVar252;
      fVar254 = fVar244 * fVar257 + fVar246 * fVar262;
      fVar213 = fVar257 * fVar239 + auVar204._0_4_;
      fVar256 = fVar257 * fVar243 + auVar204._8_4_;
      auVar15._4_8_ = auVar204._8_8_;
      auVar15._0_4_ = fVar273 * fVar257 + fVar273 * fVar262;
      auVar205._0_8_ = auVar15._0_8_ << 0x20;
      auVar205._8_4_ = fVar264;
      auVar205._12_4_ = fVar242 * fVar257 + fVar242 * fVar262;
      fVar214 = fVar263;
      if (fVar263 <= fVar165) {
        fVar214 = fVar165;
        fVar165 = fVar263;
      }
      auVar206._8_8_ = auVar205._8_8_;
      auVar206._0_8_ = auVar206._8_8_;
      auVar215._8_4_ = fVar254;
      auVar215._12_4_ = fVar246 * fVar257 + fVar246 * fVar262;
      if (fVar213 <= fVar252) {
        auVar215._0_4_ = fVar213;
      }
      if (auVar215._0_4_ <= fVar165) {
        fVar165 = auVar215._0_4_;
      }
      auVar16._4_8_ = auVar215._8_8_;
      auVar16._0_4_ = fVar257 * fVar241 + auVar204._4_4_;
      auVar216._0_8_ = auVar16._0_8_ << 0x20;
      auVar216._8_4_ = fVar256;
      auVar216._12_4_ = fVar257 * fVar245 + auVar204._12_4_;
      if (fVar213 <= fVar252) {
        fVar213 = fVar252;
      }
      auVar217._8_8_ = auVar216._8_8_;
      auVar217._0_8_ = auVar217._8_8_;
      if (fVar213 <= fVar214) {
        fVar213 = fVar214;
      }
      if (fVar264 <= fVar180) {
        auVar206._0_4_ = fVar180;
        fVar180 = fVar264;
      }
      fVar214 = fVar254;
      if (fVar256 <= fVar254) {
        fVar214 = fVar256;
      }
      if (fVar214 <= fVar180) {
        fVar180 = fVar214;
      }
      if (fVar256 <= fVar254) {
        auVar217._0_4_ = fVar254;
      }
      if (auVar217._0_4_ <= auVar206._0_4_) {
        auVar217._0_4_ = auVar206._0_4_;
      }
      bVar52 = 3 < (uint)uVar50;
      uVar17 = (undefined3)(uVar57 >> 8);
      uVar42 = (ulong)CONCAT31(uVar17,bVar52);
      fVar214 = auVar217._0_4_;
      if ((0.0001 <= fVar165) || (fVar214 <= -0.0001)) {
        if ((-0.0001 < fVar213 && fVar180 < 0.0001) ||
           ((fVar165 < 0.0001 && -0.0001 < fVar213 || (fVar180 < 0.0001 && -0.0001 < fVar214))))
        goto LAB_00b713c1;
        bVar20 = true;
        pRVar48 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar48 >> 8),fVar92 < 0.001);
      }
      else {
LAB_00b713c1:
        bVar52 = bVar52 || fVar92 < 0.001;
        uVar42 = (ulong)CONCAT31(uVar17,bVar52);
        fVar256 = (float)(~-(uint)(fVar165 < 0.0) & 0x3f800000 | -(uint)(fVar165 < 0.0) & 0xbf800000
                         );
        fVar254 = (float)(~-(uint)(fVar213 < 0.0) & 0x3f800000 | -(uint)(fVar213 < 0.0) & 0xbf800000
                         );
        fVar252 = 0.0;
        if ((fVar256 == fVar254) && (!NAN(fVar256) && !NAN(fVar254))) {
          fVar252 = INFINITY;
        }
        fVar257 = 0.0;
        if ((fVar256 == fVar254) && (!NAN(fVar256) && !NAN(fVar254))) {
          fVar257 = -INFINITY;
        }
        fVar262 = (float)(~-(uint)(fVar180 < 0.0) & 0x3f800000 | -(uint)(fVar180 < 0.0) & 0xbf800000
                         );
        if ((fVar256 != fVar262) || (fVar263 = fVar257, NAN(fVar256) || NAN(fVar262))) {
          if ((fVar180 != fVar165) || (NAN(fVar180) || NAN(fVar165))) {
            fVar263 = -fVar165 / (fVar180 - fVar165);
            fVar263 = (1.0 - fVar263) * 0.0 + fVar263;
            fVar180 = fVar263;
          }
          else {
            fVar180 = INFINITY;
            if ((fVar165 == 0.0) && (fVar180 = INFINITY, !NAN(fVar165))) {
              fVar180 = 0.0;
            }
            fVar263 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar165 == 0.0) & 1) * 4);
          }
          if (fVar180 <= fVar252) {
            fVar252 = fVar180;
          }
          if (fVar263 <= fVar257) {
            fVar263 = fVar257;
          }
        }
        pRVar48 = (RTCIntersectArguments *)(ulong)(fVar214 < 0.0);
        fVar165 = *(float *)(&DAT_01ff1ecc + (long)pRVar48 * 4);
        if ((fVar254 != fVar165) || (fVar180 = fVar263, NAN(fVar254) || NAN(fVar165))) {
          if ((fVar214 != fVar213) || (NAN(fVar214) || NAN(fVar213))) {
            fVar180 = -fVar213 / (fVar214 - fVar213);
            fVar180 = (1.0 - fVar180) * 0.0 + fVar180;
            fVar214 = fVar180;
          }
          else {
            fVar214 = INFINITY;
            if ((fVar213 == 0.0) && (fVar214 = INFINITY, !NAN(fVar213))) {
              fVar214 = 0.0;
            }
            pRVar48 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar213 == 0.0) & 1);
            fVar180 = *(float *)(&DAT_01ff1ec4 + (long)pRVar48 * 4);
          }
          if (fVar214 <= fVar252) {
            fVar252 = fVar214;
          }
          if (fVar180 <= fVar263) {
            fVar180 = fVar263;
          }
        }
        if ((fVar262 != fVar165) || (NAN(fVar262) || NAN(fVar165))) {
          fVar252 = (float)(~-(uint)(fVar252 < 1.0) & 0x3f800000 |
                           (uint)fVar252 & -(uint)(fVar252 < 1.0));
          fVar180 = (float)(~-(uint)(fVar180 < 1.0) & (uint)fVar180 |
                           -(uint)(fVar180 < 1.0) & 0x3f800000);
        }
        fVar252 = (float)(~-(uint)(fVar252 < 0.0) & (uint)fVar252);
        fVar165 = (float)(~-(uint)(fVar180 < 1.0) & 0x3f800000 |
                         (uint)fVar180 & -(uint)(fVar180 < 1.0));
        bVar20 = true;
        if (fVar252 <= fVar165) {
          fVar252 = fVar252 + -0.1;
          fVar165 = fVar165 + 0.1;
          uVar56 = -(uint)(fVar165 < 1.0);
          fVar252 = (float)(~-(uint)(fVar252 < 0.0) & (uint)fVar252);
          fVar263 = (float)(~uVar56 & 0x3f800000 | (uint)fVar165 & uVar56);
          fVar254 = 1.0 - fVar252;
          fVar256 = 1.0 - fVar252;
          fVar257 = 1.0 - fVar263;
          fVar262 = 1.0 - fVar263;
          fVar165 = fVar221 * fVar254 + fVar228 * fVar252;
          fVar180 = fVar222 * fVar256 + fVar230 * fVar252;
          fVar213 = fVar221 * fVar257 + fVar223 * fVar263;
          fVar214 = fVar222 * fVar262 + fVar229 * fVar263;
          fVar221 = fVar253 * fVar254 + fVar275 * fVar252;
          fVar222 = fVar273 * fVar256 + fVar242 * fVar252;
          fVar253 = fVar253 * fVar257 + fVar275 * fVar263;
          fVar273 = fVar273 * fVar262 + fVar242 * fVar263;
          fVar275 = fVar265 * fVar254 + fVar244 * fVar252;
          fVar242 = fVar272 * fVar256 + fVar246 * fVar252;
          fVar265 = fVar265 * fVar257 + fVar244 * fVar263;
          fVar272 = fVar272 * fVar262 + fVar246 * fVar263;
          fVar243 = fVar254 * fVar239 + fVar243 * fVar252;
          fVar245 = fVar256 * fVar241 + fVar245 * fVar252;
          fVar239 = fVar257 * fVar239 + fStack_540 * fVar263;
          fVar241 = fVar262 * fVar241 + fStack_53c * fVar263;
          fVar266 = fVar251 * (1.0 - fVar252) + fVar255 * fVar252;
          fStack_53c = fVar251 * (1.0 - fVar263) + fVar255 * fVar263;
          fVar92 = 1.0 / fVar92;
          auVar105._0_4_ = fVar239 - fVar243;
          auVar105._4_4_ = fVar241 - fVar245;
          auVar105._8_4_ = fVar239 - fVar239;
          auVar105._12_4_ = fVar241 - fVar241;
          auVar136._0_8_ = CONCAT44(fVar272 - fVar242,fVar265 - fVar275);
          auVar136._8_4_ = fVar265 - fVar265;
          auVar136._12_4_ = fVar272 - fVar272;
          auVar226._0_4_ = fVar253 - fVar221;
          auVar226._4_4_ = fVar273 - fVar222;
          auVar226._8_4_ = fVar253 - fVar253;
          auVar226._12_4_ = fVar273 - fVar273;
          auVar197._0_8_ = CONCAT44((fVar222 - fVar180) * 3.0,(fVar221 - fVar165) * 3.0);
          auVar197._8_4_ = (fVar253 - fVar213) * 3.0;
          auVar197._12_4_ = (fVar273 - fVar214) * 3.0;
          auVar161._0_8_ = CONCAT44((fVar242 - fVar222) * 3.0,(fVar275 - fVar221) * 3.0);
          auVar161._8_4_ = (fVar265 - fVar253) * 3.0;
          auVar161._12_4_ = (fVar272 - fVar273) * 3.0;
          auVar218._0_4_ = (fVar243 - fVar275) * 3.0;
          auVar218._4_4_ = (fVar245 - fVar242) * 3.0;
          auVar218._8_4_ = (fVar239 - fVar265) * 3.0;
          auVar218._12_4_ = (fVar241 - fVar272) * 3.0;
          auVar170._8_4_ = auVar161._8_4_;
          auVar170._0_8_ = auVar161._0_8_;
          auVar170._12_4_ = auVar161._12_4_;
          auVar157 = minps(auVar170,auVar218);
          auVar68 = maxps(auVar161,auVar218);
          auVar207._8_4_ = auVar197._8_4_;
          auVar207._0_8_ = auVar197._0_8_;
          auVar207._12_4_ = auVar197._12_4_;
          auVar115 = minps(auVar207,auVar157);
          auVar158 = maxps(auVar197,auVar68);
          auVar18._4_8_ = auVar68._8_8_;
          auVar18._0_4_ = auVar115._4_4_;
          auVar162._0_8_ = auVar18._0_8_ << 0x20;
          auVar162._8_4_ = auVar115._8_4_;
          auVar162._12_4_ = auVar115._12_4_;
          auVar163._8_8_ = auVar115._8_8_;
          auVar163._0_8_ = auVar162._8_8_;
          auVar19._4_8_ = auVar157._8_8_;
          auVar19._0_4_ = auVar158._4_4_;
          auVar171._0_8_ = auVar19._0_8_ << 0x20;
          auVar171._8_4_ = auVar158._8_4_;
          auVar171._12_4_ = auVar158._12_4_;
          auVar172._8_8_ = auVar158._8_8_;
          auVar172._0_8_ = auVar171._8_8_;
          auVar157 = minps(auVar115,auVar163);
          auVar68 = maxps(auVar158,auVar172);
          fVar254 = auVar157._0_4_ * fVar92;
          fVar256 = auVar157._4_4_ * fVar92;
          fVar257 = auVar157._8_4_ * fVar92;
          fVar262 = auVar157._12_4_ * fVar92;
          fVar253 = fVar92 * auVar68._0_4_;
          fVar255 = fVar92 * auVar68._4_4_;
          fVar275 = fVar92 * auVar68._8_4_;
          fVar92 = fVar92 * auVar68._12_4_;
          fVar246 = 1.0 / (fStack_53c - fVar266);
          auVar126._0_8_ = CONCAT44(fVar214 - fVar180,fVar213 - fVar165);
          auVar126._8_4_ = fVar213 - fVar213;
          auVar126._12_4_ = fVar214 - fVar214;
          auVar173._8_4_ = auVar126._8_4_;
          auVar173._0_8_ = auVar126._0_8_;
          auVar173._12_4_ = auVar126._12_4_;
          auVar158 = minps(auVar173,auVar226);
          auVar157 = maxps(auVar126,auVar226);
          auVar86._8_4_ = auVar136._8_4_;
          auVar86._0_8_ = auVar136._0_8_;
          auVar86._12_4_ = auVar136._12_4_;
          auVar68 = minps(auVar86,auVar105);
          auVar158 = minps(auVar158,auVar68);
          auVar68 = maxps(auVar136,auVar105);
          auVar68 = maxps(auVar157,auVar68);
          fVar272 = auVar158._0_4_ * fVar246;
          fVar244 = auVar158._4_4_ * fVar246;
          fVar252 = fVar246 * auVar68._0_4_;
          fVar246 = fVar246 * auVar68._4_4_;
          local_528 = CONCAT44(fStack_53c,fVar266);
          auVar164._4_4_ = fStack_53c;
          auVar164._0_4_ = fVar149;
          auVar164._8_4_ = fVar150;
          auVar164._12_4_ = fVar93;
          local_b8 = (fVar110 + fVar149) * 0.5;
          fVar165 = (fVar266 + fStack_53c) * 0.5;
          fVar180 = (fVar149 + fVar150) * 0.0;
          fVar213 = (fStack_53c + fVar93) * 0.0;
          fVar214 = local_118 * local_b8 + fVar199;
          fVar221 = fStack_114 * local_b8 + fVar200;
          fVar222 = fStack_110 * local_b8 + fVar178;
          fVar239 = fStack_10c * local_b8 + fVar179;
          fVar241 = local_128 * local_b8 + fVar201;
          fVar243 = fStack_124 * local_b8 + fVar212;
          fVar245 = fStack_120 * local_b8 + fVar144;
          fVar251 = fStack_11c * local_b8 + fVar167;
          fVar214 = (fVar241 - fVar214) * local_b8 + fVar214;
          fVar221 = (fVar243 - fVar221) * local_b8 + fVar221;
          fVar222 = (fVar245 - fVar222) * local_b8 + fVar222;
          fVar239 = (fVar251 - fVar239) * local_b8 + fVar239;
          fVar241 = (((local_138 * local_b8 + fVar142) - fVar241) * local_b8 + fVar241) - fVar214;
          fVar243 = (((fStack_134 * local_b8 + fVar143) - fVar243) * local_b8 + fVar243) - fVar221;
          fVar245 = (((fStack_130 * local_b8 + fVar111) - fVar245) * local_b8 + fVar245) - fVar222;
          fVar251 = (((fStack_12c * local_b8 + fVar128) - fVar251) * local_b8 + fVar251) - fVar239;
          fVar214 = local_b8 * fVar241 + fVar214;
          fVar221 = local_b8 * fVar243 + fVar221;
          fVar241 = fVar241 * 3.0;
          fVar243 = fVar243 * 3.0;
          fVar222 = (local_b8 * fVar245 + fVar222) - fVar214;
          fVar239 = (local_b8 * fVar251 + fVar239) - fVar221;
          fVar241 = (fVar245 * 3.0 - fVar241) * fVar165 + fVar241;
          fVar243 = (fVar251 * 3.0 - fVar243) * fVar165 + fVar243;
          auVar106._0_8_ = CONCAT44(fVar241,fVar222) ^ 0x80000000;
          auVar106._8_4_ = fVar241;
          auVar106._12_4_ = fVar241;
          fVar263 = fVar110 - local_b8;
          fVar264 = fVar266 - fVar165;
          fVar274 = fVar149 - fVar180;
          fVar276 = fStack_53c - fVar213;
          fVar231 = fVar149 - local_b8;
          fVar240 = fStack_53c - fVar165;
          fVar150 = fVar150 - fVar180;
          fVar93 = fVar93 - fVar213;
          fVar214 = fVar222 * fVar165 + fVar214;
          fVar221 = fVar239 * fVar165 + fVar221;
          auVar127._0_8_ = CONCAT44(fVar243,fVar239) ^ 0x8000000000000000;
          auVar127._8_4_ = -fVar243;
          auVar127._12_4_ = -fVar243;
          auVar248._0_4_ = fVar239 * fVar241 - fVar243 * fVar222;
          auVar248._4_4_ = auVar248._0_4_;
          auVar248._8_4_ = auVar248._0_4_;
          auVar248._12_4_ = auVar248._0_4_;
          auVar157 = divps(auVar127,auVar248);
          auVar68 = divps(auVar106,auVar248);
          fVar239 = auVar157._0_4_;
          fVar241 = auVar157._4_4_;
          fVar213 = auVar68._0_4_;
          fVar222 = auVar68._4_4_;
          local_b8 = local_b8 - (fVar221 * fVar213 + fVar214 * fVar239);
          local_a8 = fVar165 - (fVar221 * fVar222 + fVar214 * fVar241);
          fVar180 = fVar165 - (fVar221 * auVar68._8_4_ + fVar214 * auVar157._8_4_);
          fVar165 = fVar165 - (fVar221 * auVar68._12_4_ + fVar214 * auVar157._12_4_);
          auVar269._0_8_ = CONCAT44(fVar241 * fVar272,fVar241 * fVar254);
          auVar269._8_4_ = fVar241 * fVar256;
          auVar269._12_4_ = fVar241 * fVar244;
          auVar219._0_4_ = fVar241 * fVar253;
          auVar219._4_4_ = fVar241 * fVar252;
          auVar219._8_4_ = fVar241 * fVar255;
          auVar219._12_4_ = fVar241 * fVar246;
          auVar280._8_4_ = auVar269._8_4_;
          auVar280._0_8_ = auVar269._0_8_;
          auVar280._12_4_ = auVar269._12_4_;
          auVar115 = minps(auVar280,auVar219);
          auVar157 = maxps(auVar219,auVar269);
          auVar137._0_8_ = CONCAT44(fVar222 * fVar244,fVar222 * fVar256);
          auVar137._8_4_ = fVar222 * fVar257;
          auVar137._12_4_ = fVar222 * fVar262;
          auVar270._0_4_ = fVar222 * fVar255;
          auVar270._4_4_ = fVar222 * fVar246;
          auVar270._8_4_ = fVar222 * fVar275;
          auVar270._12_4_ = fVar222 * fVar92;
          auVar208._8_4_ = auVar137._8_4_;
          auVar208._0_8_ = auVar137._0_8_;
          auVar208._12_4_ = auVar137._12_4_;
          auVar68 = minps(auVar208,auVar270);
          auVar158 = maxps(auVar270,auVar137);
          fVar214 = 0.0 - (auVar158._0_4_ + auVar157._0_4_);
          fVar221 = 1.0 - (auVar158._4_4_ + auVar157._4_4_);
          fVar243 = 0.0 - (auVar158._8_4_ + auVar157._8_4_);
          fVar245 = 0.0 - (auVar158._12_4_ + auVar157._12_4_);
          fVar251 = 0.0 - (auVar68._0_4_ + auVar115._0_4_);
          fVar273 = 1.0 - (auVar68._4_4_ + auVar115._4_4_);
          fVar242 = 0.0 - (auVar68._8_4_ + auVar115._8_4_);
          fVar265 = 0.0 - (auVar68._12_4_ + auVar115._12_4_);
          auVar220._0_8_ = CONCAT44(fVar264 * fVar221,fVar263 * fVar214);
          auVar220._8_4_ = fVar274 * fVar243;
          auVar220._12_4_ = fVar276 * fVar245;
          auVar249._0_8_ = CONCAT44(fVar272 * fVar239,fVar254 * fVar239);
          auVar249._8_4_ = fVar256 * fVar239;
          auVar249._12_4_ = fVar244 * fVar239;
          auVar209._0_4_ = fVar239 * fVar253;
          auVar209._4_4_ = fVar239 * fVar252;
          auVar209._8_4_ = fVar239 * fVar255;
          auVar209._12_4_ = fVar239 * fVar246;
          auVar260._8_4_ = auVar249._8_4_;
          auVar260._0_8_ = auVar249._0_8_;
          auVar260._12_4_ = auVar249._12_4_;
          auVar157 = minps(auVar260,auVar209);
          auVar68 = maxps(auVar209,auVar249);
          auVar174._0_8_ = CONCAT44(fVar244 * fVar213,fVar256 * fVar213);
          auVar174._8_4_ = fVar257 * fVar213;
          auVar174._12_4_ = fVar262 * fVar213;
          auVar271._0_4_ = fVar213 * fVar255;
          auVar271._4_4_ = fVar213 * fVar246;
          auVar271._8_4_ = fVar213 * fVar275;
          auVar271._12_4_ = fVar213 * fVar92;
          auVar281._8_4_ = auVar174._8_4_;
          auVar281._0_8_ = auVar174._0_8_;
          auVar281._12_4_ = auVar174._12_4_;
          auVar115 = minps(auVar281,auVar271);
          auVar250._0_4_ = fVar263 * fVar251;
          auVar250._4_4_ = fVar264 * fVar273;
          auVar250._8_4_ = fVar274 * fVar242;
          auVar250._12_4_ = fVar276 * fVar265;
          auVar138._0_8_ = CONCAT44(fVar221 * fVar240,fVar214 * fVar231);
          auVar138._8_4_ = fVar243 * fVar150;
          auVar138._12_4_ = fVar245 * fVar93;
          auVar148._0_4_ = fVar251 * fVar231;
          auVar148._4_4_ = fVar273 * fVar240;
          auVar148._8_4_ = fVar242 * fVar150;
          auVar148._12_4_ = fVar265 * fVar93;
          auVar158 = maxps(auVar271,auVar174);
          fVar92 = 1.0 - (auVar158._0_4_ + auVar68._0_4_);
          fVar214 = 0.0 - (auVar158._4_4_ + auVar68._4_4_);
          fVar221 = 0.0 - (auVar158._8_4_ + auVar68._8_4_);
          fVar243 = 0.0 - (auVar158._12_4_ + auVar68._12_4_);
          fVar245 = 1.0 - (auVar115._0_4_ + auVar157._0_4_);
          fVar251 = 0.0 - (auVar115._4_4_ + auVar157._4_4_);
          fVar253 = 0.0 - (auVar115._8_4_ + auVar157._8_4_);
          fVar255 = 0.0 - (auVar115._12_4_ + auVar157._12_4_);
          auVar210._0_8_ = CONCAT44(fVar264 * fVar214,fVar263 * fVar92);
          auVar210._8_4_ = fVar274 * fVar221;
          auVar210._12_4_ = fVar276 * fVar243;
          auVar227._0_4_ = fVar263 * fVar245;
          auVar227._4_4_ = fVar264 * fVar251;
          auVar227._8_4_ = fVar274 * fVar253;
          auVar227._12_4_ = fVar276 * fVar255;
          auVar175._0_8_ = CONCAT44(fVar214 * fVar240,fVar92 * fVar231);
          auVar175._8_4_ = fVar221 * fVar150;
          auVar175._12_4_ = fVar243 * fVar93;
          auVar198._0_4_ = fVar245 * fVar231;
          auVar198._4_4_ = fVar251 * fVar240;
          auVar198._8_4_ = fVar253 * fVar150;
          auVar198._12_4_ = fVar255 * fVar93;
          auVar238._8_4_ = auVar210._8_4_;
          auVar238._0_8_ = auVar210._0_8_;
          auVar238._12_4_ = auVar210._12_4_;
          auVar68 = minps(auVar238,auVar227);
          auVar261._8_4_ = auVar175._8_4_;
          auVar261._0_8_ = auVar175._0_8_;
          auVar261._12_4_ = auVar175._12_4_;
          auVar157 = minps(auVar261,auVar198);
          auVar115 = minps(auVar68,auVar157);
          auVar157 = maxps(auVar227,auVar210);
          auVar68 = maxps(auVar198,auVar175);
          auVar158 = maxps(auVar68,auVar157);
          auVar176._8_4_ = auVar220._8_4_;
          auVar176._0_8_ = auVar220._0_8_;
          auVar176._12_4_ = auVar220._12_4_;
          auVar68 = minps(auVar176,auVar250);
          auVar211._8_4_ = auVar138._8_4_;
          auVar211._0_8_ = auVar138._0_8_;
          auVar211._12_4_ = auVar138._12_4_;
          auVar157 = minps(auVar211,auVar148);
          auVar157 = minps(auVar68,auVar157);
          auVar268 = maxps(auVar250,auVar220);
          auVar68 = maxps(auVar148,auVar138);
          auVar68 = maxps(auVar68,auVar268);
          auVar177._0_4_ = auVar115._4_4_ + auVar115._0_4_ + local_b8;
          auVar177._4_4_ = auVar157._4_4_ + auVar157._0_4_ + local_a8;
          auVar177._8_4_ = auVar115._8_4_ + auVar115._4_4_ + fVar180;
          auVar177._12_4_ = auVar115._12_4_ + auVar157._4_4_ + fVar165;
          fVar92 = auVar158._4_4_ + auVar158._0_4_ + local_b8;
          fVar93 = auVar68._4_4_ + auVar68._0_4_ + local_a8;
          auVar139._4_4_ = fVar93;
          auVar139._0_4_ = fVar92;
          auVar24._4_4_ = fVar266;
          auVar24._0_4_ = fVar110;
          auVar24._8_4_ = fVar149;
          auVar24._12_4_ = fStack_53c;
          auVar157 = maxps(auVar24,auVar177);
          auVar139._8_4_ = auVar158._8_4_ + auVar158._4_4_ + fVar180;
          auVar139._12_4_ = auVar158._12_4_ + auVar68._4_4_ + fVar165;
          auVar68 = minps(auVar139,auVar164);
          iVar46 = -(uint)(auVar68._0_4_ < auVar157._0_4_);
          iVar55 = -(uint)(auVar68._4_4_ < auVar157._4_4_);
          auVar141._4_4_ = iVar55;
          auVar141._0_4_ = iVar46;
          auVar141._8_4_ = iVar55;
          auVar141._12_4_ = iVar55;
          auVar140._8_8_ = auVar141._8_8_;
          auVar140._4_4_ = iVar46;
          auVar140._0_4_ = iVar46;
          uVar56 = movmskpd((int)pRVar48,auVar140);
          pRVar48 = (RTCIntersectArguments *)(ulong)uVar56;
          fStack_540 = fVar149;
          if (uVar56 == 0) {
            pRVar48 = (RTCIntersectArguments *)0x0;
            if (auVar177._0_4_ <= fVar110) {
              auVar282._4_4_ = fVar200;
              auVar282._0_4_ = fVar199;
              auVar282._8_4_ = fVar178;
              auVar282._12_4_ = fVar179;
            }
            else {
              auVar282._4_4_ = fVar200;
              auVar282._0_4_ = fVar199;
              auVar282._8_4_ = fVar178;
              auVar282._12_4_ = fVar179;
              if (fVar92 < fVar149) {
                iVar46 = -(uint)(fVar93 < fStack_53c);
                pRVar48 = (RTCIntersectArguments *)
                          (ulong)CONCAT11((char)((uint)iVar46 >> 8),
                                          (byte)iVar46 & fVar266 < auVar177._4_4_);
              }
            }
            bVar41 = bVar52 | (byte)pRVar48;
            uVar42 = (ulong)CONCAT31(uVar17,bVar41);
            if (bVar41 == 1) {
              uVar42 = 200;
              do {
                fVar93 = 1.0 - local_b8;
                fVar150 = local_b8 * local_b8 * local_b8;
                fVar149 = local_b8 * local_b8 * 3.0 * fVar93;
                fVar92 = fVar93 * fVar93 * fVar93;
                fVar165 = local_b8 * 3.0 * fVar93 * fVar93;
                fVar93 = fVar92 * auVar282._0_4_ +
                         fVar165 * fVar201 + fVar149 * fVar142 + fVar150 * fVar166;
                fVar110 = fVar92 * auVar282._4_4_ +
                          fVar165 * fVar212 + fVar149 * fVar143 + fVar150 * fVar130;
                fVar93 = ((fVar92 * auVar282._8_4_ +
                          fVar165 * fVar144 + fVar149 * fVar111 + fVar150 * fVar60) - fVar93) *
                         local_a8 + fVar93;
                fVar110 = ((fVar92 * auVar282._12_4_ +
                           fVar165 * fVar167 + fVar149 * fVar128 + fVar150 * fVar59) - fVar110) *
                          local_a8 + fVar110;
                local_b8 = local_b8 - (fVar110 * fVar213 + fVar93 * fVar239);
                local_a8 = local_a8 - (fVar110 * fVar222 + fVar93 * fVar241);
                fVar92 = ABS(fVar110);
                if (ABS(fVar110) <= ABS(fVar93)) {
                  fVar92 = ABS(fVar93);
                }
                if (fVar92 < fVar129) {
                  if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) && (0.0 <= local_a8)) &&
                     (local_a8 <= 1.0)) {
                    fVar92 = pre->ray_space[k].vx.field_0.m128[2];
                    fVar93 = pre->ray_space[k].vy.field_0.m128[2];
                    fVar110 = pre->ray_space[k].vz.field_0.m128[2];
                    fVar214 = 1.0 - local_a8;
                    fVar213 = 1.0 - local_b8;
                    fVar149 = fVar213 * fVar213 * fVar213;
                    fVar150 = local_b8 * 3.0 * fVar213 * fVar213;
                    fVar180 = local_b8 * local_b8 * local_b8;
                    fVar165 = local_b8 * local_b8 * 3.0 * fVar213;
                    fVar92 = ((fStack_140 * fVar110 + fStack_144 * fVar93 + local_148 * fVar92) *
                              fVar214 +
                             (fStack_180 * fVar110 + fStack_184 * fVar93 + local_188 * fVar92) *
                             local_a8) * fVar149 +
                             ((fStack_150 * fVar110 + fStack_154 * fVar93 + local_158 * fVar92) *
                              fVar214 +
                             (fStack_190 * fVar110 + fStack_194 * fVar93 + local_198 * fVar92) *
                             local_a8) * fVar150 +
                             ((fStack_160 * fVar110 + fStack_164 * fVar93 + local_168 * fVar92) *
                              fVar214 +
                             (fStack_1a0 * fVar110 + fStack_1a4 * fVar93 + local_1a8 * fVar92) *
                             local_a8) * fVar165 +
                             (fVar214 * (fStack_170 * fVar110 +
                                        fStack_174 * fVar93 + local_178 * fVar92) +
                             (fVar110 * fStack_1b0 + fVar93 * fStack_1b4 + fVar92 * local_1b8) *
                             local_a8) * fVar180;
                    if ((fVar91 <= fVar92) &&
                       (fVar93 = *(float *)(ray + k * 4 + 0x80), fVar92 <= fVar93)) {
                      fVar222 = 1.0 - local_a8;
                      fVar239 = 1.0 - local_a8;
                      fVar241 = 1.0 - local_a8;
                      fVar110 = local_3d8 * fVar222 + local_278 * local_a8;
                      fVar214 = fStack_3d4 * fVar239 + fStack_274 * local_a8;
                      fVar221 = fStack_3d0 * fVar241 + fStack_270 * local_a8;
                      fVar228 = local_3f8 * fVar222 + fVar228 * local_a8;
                      fVar243 = fStack_3f4 * fVar239 + fVar230 * local_a8;
                      fVar251 = fStack_3f0 * fVar241 + fVar151 * local_a8;
                      fVar230 = fVar228 - fVar110;
                      fVar245 = fVar243 - fVar214;
                      fVar253 = fVar251 - fVar221;
                      fVar110 = (((fVar110 - (local_3c8 * fVar222 + local_3b8 * local_a8)) * fVar213
                                 + local_b8 * fVar230) * fVar213 +
                                (fVar230 * fVar213 +
                                ((fVar222 * local_3e8 + fVar94 * local_a8) - fVar228) * local_b8) *
                                local_b8) * 3.0;
                      fVar214 = (((fVar214 - (fStack_3c4 * fVar239 + fStack_3b4 * local_a8)) *
                                  fVar213 + local_b8 * fVar245) * fVar213 +
                                (fVar245 * fVar213 +
                                ((fVar239 * fStack_3e4 + fVar95 * local_a8) - fVar243) * local_b8) *
                                local_b8) * 3.0;
                      fVar213 = (((fVar221 - (fStack_3c0 * fVar241 + fStack_3b0 * local_a8)) *
                                  fVar213 + local_b8 * fVar253) * fVar213 +
                                (fVar253 * fVar213 +
                                ((fVar241 * fStack_3e0 + fVar109 * local_a8) - fVar251) * local_b8)
                                * local_b8) * 3.0;
                      pGVar7 = (context->scene->geometries).items[(long)pRVar49].ptr;
                      uVar42 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                      pRVar48 = pRVar49;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar221 = fVar149 * local_288 +
                                  fVar150 * local_298 + fVar165 * local_2a8 + fVar180 * local_2b8;
                        fVar222 = fVar149 * fStack_284 +
                                  fVar150 * fStack_294 + fVar165 * fStack_2a4 + fVar180 * fStack_2b4
                        ;
                        fVar149 = fVar149 * fStack_280 +
                                  fVar150 * fStack_290 + fVar165 * fStack_2a0 + fVar180 * fStack_2b0
                        ;
                        local_c8 = fVar222 * fVar110 - fVar214 * fVar221;
                        local_e8._0_4_ = fVar149 * fVar214 - fVar213 * fVar222;
                        local_d8 = fVar221 * fVar213 - fVar110 * fVar149;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar92;
                          *(undefined4 *)(ray + k * 4 + 0xc0) = local_e8._0_4_;
                          *(float *)(ray + k * 4 + 0xd0) = local_d8;
                          *(float *)(ray + k * 4 + 0xe0) = local_c8;
                          *(float *)(ray + k * 4 + 0xf0) = local_b8;
                          *(float *)(ray + k * 4 + 0x100) = local_a8;
                          *(uint *)(ray + k * 4 + 0x110) = uVar54;
                          *(uint *)(ray + k * 4 + 0x120) = uVar53;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          uVar56 = context->user->instPrimID[0];
                          uVar42 = (ulong)uVar56;
                          *(uint *)(ray + k * 4 + 0x140) = uVar56;
                        }
                        else {
                          local_e8._4_4_ = local_e8._0_4_;
                          local_e8._8_4_ = local_e8._0_4_;
                          fStack_dc = (float)local_e8._0_4_;
                          fStack_d4 = local_d8;
                          fStack_d0 = local_d8;
                          fStack_cc = local_d8;
                          fStack_c4 = local_c8;
                          fStack_c0 = local_c8;
                          fStack_bc = local_c8;
                          fStack_b4 = local_b8;
                          fStack_b0 = local_b8;
                          fStack_ac = local_b8;
                          fStack_a4 = local_a8;
                          fStack_a0 = local_a8;
                          fStack_9c = local_a8;
                          local_98 = CONCAT44(uStack_2e4,local_2e8);
                          uStack_90 = CONCAT44(uStack_2dc,uStack_2e0);
                          local_88 = CONCAT44(uStack_2d4,local_2d8);
                          uStack_80 = CONCAT44(uStack_2cc,uStack_2d0);
                          local_78 = context->user->instID[0];
                          uStack_74 = local_78;
                          uStack_70 = local_78;
                          uStack_6c = local_78;
                          local_68 = context->user->instPrimID[0];
                          uStack_64 = local_68;
                          uStack_60 = local_68;
                          uStack_5c = local_68;
                          *(float *)(ray + k * 4 + 0x80) = fVar92;
                          local_448 = *local_430;
                          uStack_440 = local_430[1];
                          local_428.valid = (int *)&local_448;
                          local_428.geometryUserPtr = pGVar7->userPtr;
                          local_428.context = context->user;
                          local_428.hit = (RTCHitN *)local_e8;
                          local_428.N = 4;
                          p_Var44 = pGVar7->intersectionFilterN;
                          pRVar48 = (RTCIntersectArguments *)ray;
                          local_428.ray = (RTCRayN *)ray;
                          if (p_Var44 != (RTCFilterFunctionN)0x0) {
                            p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&local_428);
                          }
                          auVar87._0_4_ = -(uint)((int)local_448 == 0);
                          auVar87._4_4_ = -(uint)(local_448._4_4_ == 0);
                          auVar87._8_4_ = -(uint)((int)uStack_440 == 0);
                          auVar87._12_4_ = -(uint)(uStack_440._4_4_ == 0);
                          uVar56 = movmskps((int)p_Var44,auVar87);
                          pRVar45 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                          if ((uVar56 ^ 0xf) == 0) {
                            auVar87 = auVar87 ^ _DAT_01febe20;
                          }
                          else {
                            pRVar48 = context->args;
                            p_Var44 = pRVar48->filter;
                            if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                               (((pRVar48->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                              p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&local_428);
                            }
                            auVar107._0_4_ = -(uint)((int)local_448 == 0);
                            auVar107._4_4_ = -(uint)(local_448._4_4_ == 0);
                            auVar107._8_4_ = -(uint)((int)uStack_440 == 0);
                            auVar107._12_4_ = -(uint)(uStack_440._4_4_ == 0);
                            auVar87 = auVar107 ^ _DAT_01febe20;
                            uVar56 = movmskps((int)p_Var44,auVar107);
                            pRVar45 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                            if ((uVar56 ^ 0xf) != 0) {
                              RVar22 = *(RTCFeatureFlags *)((long)local_428.hit + 4);
                              uVar56 = *(uint *)((long)local_428.hit + 8);
                              uVar57 = *(uint *)((long)((long)local_428.hit + 8) + 4);
                              *(RTCRayQueryFlags *)(local_428.ray + 0xc0) =
                                   ~auVar107._0_4_ &
                                   *(RTCRayQueryFlags *)&(local_428.hit)->field_0x0 |
                                   *(RTCRayQueryFlags *)(local_428.ray + 0xc0) & auVar107._0_4_;
                              *(RTCFeatureFlags *)(local_428.ray + 0xc4) =
                                   ~auVar107._4_4_ & RVar22 |
                                   *(RTCFeatureFlags *)(local_428.ray + 0xc4) & auVar107._4_4_;
                              *(uint *)(local_428.ray + 200) =
                                   ~auVar107._8_4_ & uVar56 |
                                   *(uint *)(local_428.ray + 200) & auVar107._8_4_;
                              *(uint *)(local_428.ray + 0xcc) =
                                   ~auVar107._12_4_ & uVar57 |
                                   *(uint *)(local_428.ray + 0xcc) & auVar107._12_4_;
                              RVar22 = *(RTCFeatureFlags *)((long)((long)local_428.hit + 0x10) + 4);
                              uVar56 = *(uint *)((long)local_428.hit + 0x18);
                              uVar57 = *(uint *)((long)((long)local_428.hit + 0x18) + 4);
                              *(RTCRayQueryFlags *)(local_428.ray + 0xd0) =
                                   ~auVar107._0_4_ &
                                   *(RTCRayQueryFlags *)((long)local_428.hit + 0x10) |
                                   *(RTCRayQueryFlags *)(local_428.ray + 0xd0) & auVar107._0_4_;
                              *(RTCFeatureFlags *)(local_428.ray + 0xd4) =
                                   ~auVar107._4_4_ & RVar22 |
                                   *(RTCFeatureFlags *)(local_428.ray + 0xd4) & auVar107._4_4_;
                              *(uint *)(local_428.ray + 0xd8) =
                                   ~auVar107._8_4_ & uVar56 |
                                   *(uint *)(local_428.ray + 0xd8) & auVar107._8_4_;
                              *(uint *)(local_428.ray + 0xdc) =
                                   ~auVar107._12_4_ & uVar57 |
                                   *(uint *)(local_428.ray + 0xdc) & auVar107._12_4_;
                              RVar22 = ((RTCIntersectArguments *)((long)local_428.hit + 0x20))->
                                       feature_mask;
                              uVar56 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_428.hit + 0x20))->context;
                              uVar57 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_428.hit + 0x20))->context + 4);
                              *(RTCRayQueryFlags *)(local_428.ray + 0xe0) =
                                   ~auVar107._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_428.hit + 0x20))->flags |
                                   *(RTCRayQueryFlags *)(local_428.ray + 0xe0) & auVar107._0_4_;
                              *(RTCFeatureFlags *)(local_428.ray + 0xe4) =
                                   ~auVar107._4_4_ & RVar22 |
                                   *(RTCFeatureFlags *)(local_428.ray + 0xe4) & auVar107._4_4_;
                              *(uint *)(local_428.ray + 0xe8) =
                                   ~auVar107._8_4_ & uVar56 |
                                   *(uint *)(local_428.ray + 0xe8) & auVar107._8_4_;
                              *(uint *)(local_428.ray + 0xec) =
                                   ~auVar107._12_4_ & uVar57 |
                                   *(uint *)(local_428.ray + 0xec) & auVar107._12_4_;
                              RVar22 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_428.hit + 0x20))->filter + 4);
                              uVar56 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_428.hit + 0x20))->intersect;
                              uVar57 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_428.hit + 0x20))->intersect + 4
                                                );
                              *(RTCRayQueryFlags *)(local_428.ray + 0xf0) =
                                   ~auVar107._0_4_ &
                                   *(RTCRayQueryFlags *)
                                    &((RTCIntersectArguments *)((long)local_428.hit + 0x20))->filter
                                   | *(RTCRayQueryFlags *)(local_428.ray + 0xf0) & auVar107._0_4_;
                              *(RTCFeatureFlags *)(local_428.ray + 0xf4) =
                                   ~auVar107._4_4_ & RVar22 |
                                   *(RTCFeatureFlags *)(local_428.ray + 0xf4) & auVar107._4_4_;
                              *(uint *)(local_428.ray + 0xf8) =
                                   ~auVar107._8_4_ & uVar56 |
                                   *(uint *)(local_428.ray + 0xf8) & auVar107._8_4_;
                              *(uint *)(local_428.ray + 0xfc) =
                                   ~auVar107._12_4_ & uVar57 |
                                   *(uint *)(local_428.ray + 0xfc) & auVar107._12_4_;
                              RVar22 = ((RTCIntersectArguments *)((long)local_428.hit + 0x40))->
                                       feature_mask;
                              uVar56 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_428.hit + 0x40))->context;
                              uVar57 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_428.hit + 0x40))->context + 4);
                              *(RTCRayQueryFlags *)(local_428.ray + 0x100) =
                                   ~auVar107._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_428.hit + 0x40))->flags |
                                   *(RTCRayQueryFlags *)(local_428.ray + 0x100) & auVar107._0_4_;
                              *(RTCFeatureFlags *)(local_428.ray + 0x104) =
                                   ~auVar107._4_4_ & RVar22 |
                                   *(RTCFeatureFlags *)(local_428.ray + 0x104) & auVar107._4_4_;
                              *(uint *)(local_428.ray + 0x108) =
                                   ~auVar107._8_4_ & uVar56 |
                                   *(uint *)(local_428.ray + 0x108) & auVar107._8_4_;
                              *(uint *)(local_428.ray + 0x10c) =
                                   ~auVar107._12_4_ & uVar57 |
                                   *(uint *)(local_428.ray + 0x10c) & auVar107._12_4_;
                              RVar22 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_428.hit + 0x40))->filter + 4);
                              uVar56 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_428.hit + 0x40))->intersect;
                              uVar57 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_428.hit + 0x40))->intersect + 4
                                                );
                              *(RTCRayQueryFlags *)(local_428.ray + 0x110) =
                                   *(RTCRayQueryFlags *)(local_428.ray + 0x110) & auVar107._0_4_ |
                                   ~auVar107._0_4_ &
                                   *(RTCRayQueryFlags *)
                                    &((RTCIntersectArguments *)((long)local_428.hit + 0x40))->filter
                              ;
                              *(RTCFeatureFlags *)(local_428.ray + 0x114) =
                                   *(RTCFeatureFlags *)(local_428.ray + 0x114) & auVar107._4_4_ |
                                   ~auVar107._4_4_ & RVar22;
                              *(uint *)(local_428.ray + 0x118) =
                                   *(uint *)(local_428.ray + 0x118) & auVar107._8_4_ |
                                   ~auVar107._8_4_ & uVar56;
                              *(uint *)(local_428.ray + 0x11c) =
                                   *(uint *)(local_428.ray + 0x11c) & auVar107._12_4_ |
                                   ~auVar107._12_4_ & uVar57;
                              RVar22 = ((RTCIntersectArguments *)((long)local_428.hit + 0x60))->
                                       feature_mask;
                              uVar56 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_428.hit + 0x60))->context;
                              uVar57 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_428.hit + 0x60))->context + 4);
                              *(RTCRayQueryFlags *)(local_428.ray + 0x120) =
                                   *(RTCRayQueryFlags *)(local_428.ray + 0x120) & auVar107._0_4_ |
                                   ~auVar107._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_428.hit + 0x60))->flags;
                              *(RTCFeatureFlags *)(local_428.ray + 0x124) =
                                   *(RTCFeatureFlags *)(local_428.ray + 0x124) & auVar107._4_4_ |
                                   ~auVar107._4_4_ & RVar22;
                              *(uint *)(local_428.ray + 0x128) =
                                   *(uint *)(local_428.ray + 0x128) & auVar107._8_4_ |
                                   ~auVar107._8_4_ & uVar56;
                              *(uint *)(local_428.ray + 300) =
                                   *(uint *)(local_428.ray + 300) & auVar107._12_4_ |
                                   ~auVar107._12_4_ & uVar57;
                              RVar22 = *(RTCFeatureFlags *)
                                        ((long)&((RTCIntersectArguments *)
                                                ((long)local_428.hit + 0x60))->filter + 4);
                              uVar56 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_428.hit + 0x60))->intersect;
                              uVar57 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_428.hit + 0x60))->intersect + 4
                                                );
                              *(RTCRayQueryFlags *)(local_428.ray + 0x130) =
                                   ~auVar107._0_4_ &
                                   *(RTCRayQueryFlags *)
                                    &((RTCIntersectArguments *)((long)local_428.hit + 0x60))->filter
                                   | *(RTCRayQueryFlags *)(local_428.ray + 0x130) & auVar107._0_4_;
                              *(RTCFeatureFlags *)(local_428.ray + 0x134) =
                                   ~auVar107._4_4_ & RVar22 |
                                   *(RTCFeatureFlags *)(local_428.ray + 0x134) & auVar107._4_4_;
                              *(uint *)(local_428.ray + 0x138) =
                                   ~auVar107._8_4_ & uVar56 |
                                   *(uint *)(local_428.ray + 0x138) & auVar107._8_4_;
                              *(uint *)(local_428.ray + 0x13c) =
                                   ~auVar107._12_4_ & uVar57 |
                                   *(uint *)(local_428.ray + 0x13c) & auVar107._12_4_;
                              RVar22 = ((RTCIntersectArguments *)((long)local_428.hit + 0x80))->
                                       feature_mask;
                              uVar56 = *(uint *)&((RTCIntersectArguments *)
                                                 ((long)local_428.hit + 0x80))->context;
                              uVar57 = *(uint *)((long)&((RTCIntersectArguments *)
                                                        ((long)local_428.hit + 0x80))->context + 4);
                              *(RTCRayQueryFlags *)(local_428.ray + 0x140) =
                                   ~auVar107._0_4_ &
                                   ((RTCIntersectArguments *)((long)local_428.hit + 0x80))->flags |
                                   *(RTCRayQueryFlags *)(local_428.ray + 0x140) & auVar107._0_4_;
                              *(RTCFeatureFlags *)(local_428.ray + 0x144) =
                                   ~auVar107._4_4_ & RVar22 |
                                   *(RTCFeatureFlags *)(local_428.ray + 0x144) & auVar107._4_4_;
                              *(uint *)(local_428.ray + 0x148) =
                                   ~auVar107._8_4_ & uVar56 |
                                   *(uint *)(local_428.ray + 0x148) & auVar107._8_4_;
                              *(uint *)(local_428.ray + 0x14c) =
                                   ~auVar107._12_4_ & uVar57 |
                                   *(uint *)(local_428.ray + 0x14c) & auVar107._12_4_;
                              pRVar45 = (RayHitK<4> *)local_428.ray;
                              pRVar48 = (RTCIntersectArguments *)local_428.hit;
                            }
                          }
                          auVar88._0_4_ = auVar87._0_4_ << 0x1f;
                          auVar88._4_4_ = auVar87._4_4_ << 0x1f;
                          auVar88._8_4_ = auVar87._8_4_ << 0x1f;
                          auVar88._12_4_ = auVar87._12_4_ << 0x1f;
                          uVar56 = movmskps((int)pRVar45,auVar88);
                          uVar42 = (ulong)uVar56;
                          if (uVar56 == 0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar93;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                uVar42 = uVar42 - 1;
              } while (uVar42 != 0);
            }
            else {
              bVar20 = false;
            }
          }
        }
      }
    } while (bVar20);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }